

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  uint uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  RTCRayQueryContext *pRVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [12];
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  uint uVar95;
  int iVar96;
  uint uVar97;
  ulong uVar98;
  ulong uVar99;
  undefined4 uVar100;
  ulong uVar101;
  long lVar102;
  bool bVar103;
  float fVar104;
  float fVar106;
  float fVar132;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar111 [16];
  float fVar105;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar173 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [32];
  vint4 ai_2;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  float fVar208;
  float fVar218;
  vint4 ai;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar219;
  float fVar220;
  undefined1 auVar215 [32];
  undefined1 auVar214 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar221;
  float fVar230;
  float fVar231;
  vint4 bi;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar228 [32];
  float fVar250;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar229 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  float fVar238;
  undefined1 auVar240 [16];
  float fVar248;
  float fVar249;
  undefined1 auVar239 [16];
  undefined1 auVar245 [32];
  undefined1 auVar241 [16];
  float fVar251;
  float fVar252;
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  float fVar253;
  float fVar268;
  float fVar269;
  vint4 ai_1;
  float fVar270;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  float s;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float t;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar281 [32];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  float fVar290;
  float fVar291;
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar300;
  undefined1 auVar299 [64];
  float fVar301;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar305 [64];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined1 local_bc0 [32];
  float local_ba0;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 (*local_a88) [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [48];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  Primitive *local_950;
  ulong local_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined4 uStack_784;
  ulong local_780;
  undefined1 auStack_778 [24];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  uint uStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  uint uStack_5c4;
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  RTCHitN local_3c0 [32];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar182 [32];
  undefined1 auVar185 [32];
  undefined1 auVar256 [16];
  
  PVar2 = prim[1];
  uVar98 = (ulong)(byte)PVar2;
  fVar104 = *(float *)(prim + uVar98 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar98 * 0x19 + 6));
  auVar107._0_4_ = fVar104 * auVar8._0_4_;
  auVar107._4_4_ = fVar104 * auVar8._4_4_;
  auVar107._8_4_ = fVar104 * auVar8._8_4_;
  auVar107._12_4_ = fVar104 * auVar8._12_4_;
  auVar222._0_4_ = fVar104 * auVar9._0_4_;
  auVar222._4_4_ = fVar104 * auVar9._4_4_;
  auVar222._8_4_ = fVar104 * auVar9._8_4_;
  auVar222._12_4_ = fVar104 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 6 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar98 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar101 = (ulong)(uint)((int)(uVar98 * 9) * 2);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + uVar98 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  uVar101 = (ulong)(uint)((int)(uVar98 * 5) << 2);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar305 = ZEXT1664(auVar168);
  auVar312._4_4_ = auVar222._0_4_;
  auVar312._0_4_ = auVar222._0_4_;
  auVar312._8_4_ = auVar222._0_4_;
  auVar312._12_4_ = auVar222._0_4_;
  auVar134 = vshufps_avx(auVar222,auVar222,0x55);
  auVar108 = vshufps_avx(auVar222,auVar222,0xaa);
  fVar104 = auVar108._0_4_;
  auVar286._0_4_ = fVar104 * auVar10._0_4_;
  fVar132 = auVar108._4_4_;
  auVar286._4_4_ = fVar132 * auVar10._4_4_;
  fVar238 = auVar108._8_4_;
  auVar286._8_4_ = fVar238 * auVar10._8_4_;
  fVar248 = auVar108._12_4_;
  auVar286._12_4_ = fVar248 * auVar10._12_4_;
  auVar278._0_4_ = auVar13._0_4_ * fVar104;
  auVar278._4_4_ = auVar13._4_4_ * fVar132;
  auVar278._8_4_ = auVar13._8_4_ * fVar238;
  auVar278._12_4_ = auVar13._12_4_ * fVar248;
  auVar254._0_4_ = auVar168._0_4_ * fVar104;
  auVar254._4_4_ = auVar168._4_4_ * fVar132;
  auVar254._8_4_ = auVar168._8_4_ * fVar238;
  auVar254._12_4_ = auVar168._12_4_ * fVar248;
  auVar108 = vfmadd231ps_fma(auVar286,auVar134,auVar9);
  auVar116 = vfmadd231ps_fma(auVar278,auVar134,auVar12);
  auVar134 = vfmadd231ps_fma(auVar254,auVar109,auVar134);
  auVar144 = vfmadd231ps_fma(auVar108,auVar312,auVar8);
  auVar116 = vfmadd231ps_fma(auVar116,auVar312,auVar11);
  auVar210 = vfmadd231ps_fma(auVar134,auVar110,auVar312);
  auVar313._4_4_ = auVar107._0_4_;
  auVar313._0_4_ = auVar107._0_4_;
  auVar313._8_4_ = auVar107._0_4_;
  auVar313._12_4_ = auVar107._0_4_;
  auVar134 = vshufps_avx(auVar107,auVar107,0x55);
  auVar108 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar104 = auVar108._0_4_;
  auVar223._0_4_ = fVar104 * auVar10._0_4_;
  fVar132 = auVar108._4_4_;
  auVar223._4_4_ = fVar132 * auVar10._4_4_;
  fVar238 = auVar108._8_4_;
  auVar223._8_4_ = fVar238 * auVar10._8_4_;
  fVar248 = auVar108._12_4_;
  auVar223._12_4_ = fVar248 * auVar10._12_4_;
  auVar133._0_4_ = auVar13._0_4_ * fVar104;
  auVar133._4_4_ = auVar13._4_4_ * fVar132;
  auVar133._8_4_ = auVar13._8_4_ * fVar238;
  auVar133._12_4_ = auVar13._12_4_ * fVar248;
  auVar108._0_4_ = auVar168._0_4_ * fVar104;
  auVar108._4_4_ = auVar168._4_4_ * fVar132;
  auVar108._8_4_ = auVar168._8_4_ * fVar238;
  auVar108._12_4_ = auVar168._12_4_ * fVar248;
  auVar9 = vfmadd231ps_fma(auVar223,auVar134,auVar9);
  auVar10 = vfmadd231ps_fma(auVar133,auVar134,auVar12);
  auVar12 = vfmadd231ps_fma(auVar108,auVar134,auVar109);
  auVar13 = vfmadd231ps_fma(auVar9,auVar313,auVar8);
  auVar109 = vfmadd231ps_fma(auVar10,auVar313,auVar11);
  auVar168 = vfmadd231ps_fma(auVar12,auVar313,auVar110);
  local_a00._8_4_ = 0x7fffffff;
  local_a00._0_8_ = 0x7fffffff7fffffff;
  local_a00._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar144,local_a00);
  auVar209._8_4_ = 0x219392ef;
  auVar209._0_8_ = 0x219392ef219392ef;
  auVar209._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar209,1);
  auVar9 = vblendvps_avx(auVar144,auVar209,auVar8);
  auVar8 = vandps_avx(auVar116,local_a00);
  auVar8 = vcmpps_avx(auVar8,auVar209,1);
  auVar10 = vblendvps_avx(auVar116,auVar209,auVar8);
  auVar8 = vandps_avx(auVar210,local_a00);
  auVar8 = vcmpps_avx(auVar8,auVar209,1);
  auVar8 = vblendvps_avx(auVar210,auVar209,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = &DAT_3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar239);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar10);
  auVar10 = vfnmadd213ps_fma(auVar10,auVar9,auVar239);
  auVar12 = vfmadd132ps_fma(auVar10,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar239);
  auVar110 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar98 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar210._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar210._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar210._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar210._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar98 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar224._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar224._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar224._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar224._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar116._1_3_ = 0;
  auVar116[0] = PVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar98 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar109);
  auVar255._0_4_ = auVar8._0_4_ * auVar12._0_4_;
  auVar255._4_4_ = auVar8._4_4_ * auVar12._4_4_;
  auVar255._8_4_ = auVar8._8_4_ * auVar12._8_4_;
  auVar255._12_4_ = auVar8._12_4_ * auVar12._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar9);
  auVar8 = vsubps_avx(auVar8,auVar109);
  auVar134._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar134._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar134._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar134._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar101 + uVar98 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar168);
  auVar144._0_4_ = auVar110._0_4_ * auVar8._0_4_;
  auVar144._4_4_ = auVar110._4_4_ * auVar8._4_4_;
  auVar144._8_4_ = auVar110._8_4_ * auVar8._8_4_;
  auVar144._12_4_ = auVar110._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar98 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar168);
  auVar109._0_4_ = auVar110._0_4_ * auVar8._0_4_;
  auVar109._4_4_ = auVar110._4_4_ * auVar8._4_4_;
  auVar109._8_4_ = auVar110._8_4_ * auVar8._8_4_;
  auVar109._12_4_ = auVar110._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar210,auVar224);
  auVar9 = vpminsd_avx(auVar255,auVar134);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar144,auVar109);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar271._4_4_ = uVar100;
  auVar271._0_4_ = uVar100;
  auVar271._8_4_ = uVar100;
  auVar271._12_4_ = uVar100;
  auVar9 = vmaxps_avx(auVar9,auVar271);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_630._0_4_ = auVar8._0_4_ * 0.99999964;
  local_630._4_4_ = auVar8._4_4_ * 0.99999964;
  local_630._8_4_ = auVar8._8_4_ * 0.99999964;
  local_630._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar210,auVar224);
  auVar9 = vpmaxsd_avx(auVar255,auVar134);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar144,auVar109);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar168._4_4_ = uVar100;
  auVar168._0_4_ = uVar100;
  auVar168._8_4_ = uVar100;
  auVar168._12_4_ = uVar100;
  auVar9 = vminps_avx(auVar9,auVar168);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar110._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar110._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar110._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar110._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar116[4] = PVar2;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar2;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar2;
  auVar116._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar116,_DAT_01ff0cf0);
  auVar8 = vcmpps_avx(local_630,auVar110,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar95 = vmovmskps_avx(auVar8);
  if (uVar95 == 0) {
    return;
  }
  uVar95 = uVar95 & 0xff;
  auVar121._16_16_ = mm_lookupmask_ps._240_16_;
  auVar121._0_16_ = mm_lookupmask_ps._240_16_;
  local_220 = vblendps_avx(auVar121,ZEXT832(0) << 0x20,0x80);
  local_a88 = (undefined1 (*) [32])&local_2e0;
  iVar96 = 1 << ((uint)k & 0x1f);
  auVar122._4_4_ = iVar96;
  auVar122._0_4_ = iVar96;
  auVar122._8_4_ = iVar96;
  auVar122._12_4_ = iVar96;
  auVar122._16_4_ = iVar96;
  auVar122._20_4_ = iVar96;
  auVar122._24_4_ = iVar96;
  auVar122._28_4_ = iVar96;
  auVar126 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar121 = vpand_avx2(auVar122,auVar126);
  local_620 = vpcmpeqd_avx2(auVar121,auVar126);
  local_900 = 0x7fffffff;
  uStack_8fc = 0x7fffffff;
  uStack_8f8 = 0x7fffffff;
  uStack_8f4 = 0x7fffffff;
  uStack_8f0 = 0x7fffffff;
  uStack_8ec = 0x7fffffff;
  uStack_8e8 = 0x7fffffff;
  uStack_8e4 = 0x7fffffff;
  local_760 = 0x80000000;
  uStack_75c = 0x80000000;
  uStack_758 = 0x80000000;
  uStack_754 = 0x80000000;
  fStack_750 = -0.0;
  fStack_74c = -0.0;
  fStack_748 = -0.0;
  uStack_744 = 0x80000000;
  local_950 = prim;
LAB_016bd39b:
  lVar102 = 0;
  local_948 = (ulong)uVar95;
  for (uVar101 = local_948; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
    lVar102 = lVar102 + 1;
  }
  uVar95 = *(uint *)(local_950 + 2);
  uVar3 = *(uint *)(local_950 + lVar102 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar95].ptr;
  uVar101 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                            pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)uVar3);
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar102 = *(long *)&pGVar5[1].time_range.upper;
  auVar8 = *(undefined1 (*) [16])(lVar102 + (long)p_Var6 * uVar101);
  auVar9 = *(undefined1 (*) [16])(lVar102 + (uVar101 + 1) * (long)p_Var6);
  local_948 = local_948 - 1 & local_948;
  if (local_948 != 0) {
    uVar99 = local_948 - 1 & local_948;
    for (uVar98 = local_948; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
    }
    if (uVar99 != 0) {
      for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar11 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar256._4_4_ = uVar100;
  auVar256._0_4_ = uVar100;
  auVar256._8_4_ = uVar100;
  auVar256._12_4_ = uVar100;
  fStack_870 = (float)uVar100;
  _local_880 = auVar256;
  fStack_86c = (float)uVar100;
  fStack_868 = (float)uVar100;
  register0x0000141c = uVar100;
  auVar267 = ZEXT3264(_local_880);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar272._4_4_ = uVar100;
  auVar272._0_4_ = uVar100;
  auVar272._8_4_ = uVar100;
  auVar272._12_4_ = uVar100;
  fStack_8b0 = (float)uVar100;
  _local_8c0 = auVar272;
  fStack_8ac = (float)uVar100;
  fStack_8a8 = (float)uVar100;
  register0x0000145c = uVar100;
  auVar10 = vunpcklps_avx(auVar256,auVar272);
  fVar104 = *(float *)(ray + k * 4 + 0xc0);
  auVar279._4_4_ = fVar104;
  auVar279._0_4_ = fVar104;
  auVar279._8_4_ = fVar104;
  auVar279._12_4_ = fVar104;
  fStack_8d0 = fVar104;
  _local_8e0 = auVar279;
  fStack_8cc = fVar104;
  fStack_8c8 = fVar104;
  uStack_8c4 = fVar104;
  local_9f0 = vinsertps_avx(auVar10,auVar279,0x28);
  auVar288 = ZEXT1664(local_9f0);
  auVar225._0_4_ = (auVar8._0_4_ + auVar9._0_4_) * 0.5;
  auVar225._4_4_ = (auVar8._4_4_ + auVar9._4_4_) * 0.5;
  auVar225._8_4_ = (auVar8._8_4_ + auVar9._8_4_) * 0.5;
  auVar225._12_4_ = (auVar8._12_4_ + auVar9._12_4_) * 0.5;
  auVar10 = vsubps_avx(auVar225,auVar11);
  auVar10 = vdpps_avx(auVar10,local_9f0,0x7f);
  local_a10 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar299 = ZEXT1664(local_a10);
  auVar12 = vrcpss_avx(local_a10,local_a10);
  auVar13 = vfnmadd213ss_fma(auVar12,local_a10,ZEXT416(0x40000000));
  auVar246 = ZEXT1664(auVar13);
  local_240 = auVar10._0_4_ * auVar12._0_4_ * auVar13._0_4_;
  auVar236._4_4_ = local_240;
  auVar236._0_4_ = local_240;
  auVar236._8_4_ = local_240;
  auVar236._12_4_ = local_240;
  fStack_830 = local_240;
  _local_840 = auVar236;
  fStack_82c = local_240;
  fStack_828 = local_240;
  fStack_824 = local_240;
  auVar10 = vfmadd231ps_fma(auVar11,local_9f0,auVar236);
  auVar10 = vblendps_avx(auVar10,_DAT_01feba10,8);
  auVar11 = vsubps_avx(auVar8,auVar10);
  auVar12 = vsubps_avx(*(undefined1 (*) [16])(lVar102 + (uVar101 + 2) * (long)p_Var6),auVar10);
  auVar13 = vsubps_avx(auVar9,auVar10);
  auVar10 = vsubps_avx(*(undefined1 (*) [16])(lVar102 + (uVar101 + 3) * (long)p_Var6),auVar10);
  auVar207 = ZEXT1664(auVar10);
  auVar8 = vmovshdup_avx(auVar11);
  local_1a0 = auVar8._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar8 = vshufps_avx(auVar11,auVar11,0xaa);
  local_420 = auVar8._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar8 = vshufps_avx(auVar11,auVar11,0xff);
  local_440 = auVar8._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar8 = vmovshdup_avx(auVar13);
  local_1c0 = auVar8._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar8 = vshufps_avx(auVar13,auVar13,0xaa);
  local_460 = auVar8._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar8 = vshufps_avx(auVar13,auVar13,0xff);
  local_480 = auVar8._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar8 = vmovshdup_avx(auVar12);
  local_4a0 = auVar8._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar8 = vshufps_avx(auVar12,auVar12,0xaa);
  local_4c0 = auVar8._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar8 = vshufps_avx(auVar12,auVar12,0xff);
  local_4e0 = auVar8._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar8 = vmovshdup_avx(auVar10);
  local_500 = auVar8._0_8_;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  auVar8 = vshufps_avx(auVar10,auVar10,0xaa);
  local_520 = auVar8._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar8 = vshufps_avx(auVar10,auVar10,0xff);
  local_540 = auVar8._0_8_;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  auVar8 = vfmadd231ps_fma(ZEXT432((uint)(fVar104 * fVar104)),_local_8c0,_local_8c0);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_880,_local_880);
  uVar100 = auVar8._0_4_;
  local_1e0._4_4_ = uVar100;
  local_1e0._0_4_ = uVar100;
  local_1e0._8_4_ = uVar100;
  local_1e0._12_4_ = uVar100;
  local_1e0._16_4_ = uVar100;
  local_1e0._20_4_ = uVar100;
  local_1e0._24_4_ = uVar100;
  local_1e0._28_4_ = uVar100;
  fVar104 = *(float *)(ray + k * 4 + 0x60);
  local_960 = ZEXT416((uint)local_240);
  local_240 = fVar104 - local_240;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  local_5e0 = uVar95;
  uStack_5dc = uVar95;
  uStack_5d8 = uVar95;
  uStack_5d4 = uVar95;
  uStack_5d0 = uVar95;
  uStack_5cc = uVar95;
  uStack_5c8 = uVar95;
  uStack_5c4 = uVar95;
  local_600 = uVar3;
  uStack_5fc = uVar3;
  uStack_5f8 = uVar3;
  uStack_5f4 = uVar3;
  uStack_5f0 = uVar3;
  uStack_5ec = uVar3;
  uStack_5e8 = uVar3;
  uStack_5e4 = uVar3;
  uVar101 = 1;
  uVar98 = 0;
  local_560 = auVar11._0_4_;
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  local_580 = auVar13._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  local_5a0 = auVar12._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  fVar132 = auVar10._0_4_;
  local_200 = fVar132;
  fStack_1fc = fVar132;
  fStack_1f8 = fVar132;
  fStack_1f4 = fVar132;
  fStack_1f0 = fVar132;
  fStack_1ec = fVar132;
  fStack_1e8 = fVar132;
  fStack_1e4 = fVar132;
  auVar126._4_4_ = uStack_8fc;
  auVar126._0_4_ = local_900;
  auVar126._8_4_ = uStack_8f8;
  auVar126._12_4_ = uStack_8f4;
  auVar126._16_4_ = uStack_8f0;
  auVar126._20_4_ = uStack_8ec;
  auVar126._24_4_ = uStack_8e8;
  auVar126._28_4_ = uStack_8e4;
  local_5c0 = vandps_avx(local_1e0,auVar126);
  auVar8 = vsqrtss_avx(local_a10,local_a10);
  auVar9 = vsqrtss_avx(local_a10,local_a10);
  local_970 = 0x3f80000000000000;
  uStack_968 = 0;
  do {
    auVar65._8_8_ = uStack_968;
    auVar65._0_8_ = local_970;
    auVar110 = vmovshdup_avx(auVar65);
    fVar248 = (float)local_970;
    fVar238 = auVar110._0_4_ - fVar248;
    fVar105 = fVar238 * 0.04761905;
    local_9c0._4_4_ = fVar248;
    local_9c0._0_4_ = fVar248;
    local_9c0._8_4_ = fVar248;
    local_9c0._12_4_ = fVar248;
    local_9c0._16_4_ = fVar248;
    local_9c0._20_4_ = fVar248;
    local_9c0._24_4_ = fVar248;
    local_9c0._28_4_ = fVar248;
    local_800._4_4_ = fVar238;
    local_800._0_4_ = fVar238;
    local_800._8_4_ = fVar238;
    local_800._12_4_ = fVar238;
    local_800._16_4_ = fVar238;
    local_800._20_4_ = fVar238;
    local_800._24_4_ = fVar238;
    local_800._28_4_ = fVar238;
    auVar110 = vfmadd231ps_fma(local_9c0,local_800,_DAT_02020f20);
    auVar123._8_4_ = 0x3f800000;
    auVar123._0_8_ = &DAT_3f8000003f800000;
    auVar123._12_4_ = 0x3f800000;
    auVar123._16_4_ = 0x3f800000;
    auVar123._20_4_ = 0x3f800000;
    auVar123._24_4_ = 0x3f800000;
    auVar123._28_4_ = 0x3f800000;
    auVar121 = vsubps_avx(auVar123,ZEXT1632(auVar110));
    fVar220 = auVar110._0_4_;
    fVar300 = auVar110._4_4_;
    fVar218 = auVar110._8_4_;
    fVar219 = auVar110._12_4_;
    fVar238 = auVar121._0_4_;
    fVar248 = auVar121._4_4_;
    fVar249 = auVar121._8_4_;
    fVar250 = auVar121._12_4_;
    fVar106 = auVar121._16_4_;
    fVar251 = auVar121._20_4_;
    fVar252 = auVar121._24_4_;
    auVar247._28_36_ = auVar246._28_36_;
    auVar247._0_28_ =
         ZEXT1628(CONCAT412(fVar219 * fVar219,
                            CONCAT48(fVar218 * fVar218,CONCAT44(fVar300 * fVar300,fVar220 * fVar220)
                                    )));
    fVar253 = fVar220 * 3.0;
    fVar268 = fVar300 * 3.0;
    fVar269 = fVar218 * 3.0;
    fVar270 = fVar219 * 3.0;
    fVar285 = auVar267._28_4_ + -5.0;
    auVar289._0_4_ = fVar238 * fVar238;
    auVar289._4_4_ = fVar248 * fVar248;
    auVar289._8_4_ = fVar249 * fVar249;
    auVar289._12_4_ = fVar250 * fVar250;
    auVar289._16_4_ = fVar106 * fVar106;
    auVar289._20_4_ = fVar251 * fVar251;
    auVar289._28_36_ = auVar288._28_36_;
    auVar289._24_4_ = fVar252 * fVar252;
    fVar208 = auVar121._28_4_;
    auVar288._0_4_ = (auVar289._0_4_ * (fVar238 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar288._4_4_ = (auVar289._4_4_ * (fVar248 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar288._8_4_ = (auVar289._8_4_ * (fVar249 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar288._12_4_ = (auVar289._12_4_ * (fVar250 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar288._16_4_ = (auVar289._16_4_ * (fVar106 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar288._20_4_ = (auVar289._20_4_ * (fVar251 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar288._28_36_ = auVar305._28_36_;
    auVar288._24_4_ = (auVar289._24_4_ * (fVar252 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar121 = auVar288._0_32_;
    fVar221 = fVar220 * fVar220 * (float)((uint)fVar238 ^ local_760) * 0.5;
    fVar230 = fVar300 * fVar300 * (float)((uint)fVar248 ^ uStack_75c) * 0.5;
    fVar231 = fVar218 * fVar218 * (float)((uint)fVar249 ^ uStack_758) * 0.5;
    fVar232 = fVar219 * fVar219 * (float)((uint)fVar250 ^ uStack_754) * 0.5;
    fVar233 = (float)((uint)fVar106 ^ (uint)fStack_750) * 0.0 * 0.0 * 0.5;
    fVar234 = (float)((uint)fVar251 ^ (uint)fStack_74c) * 0.0 * 0.0 * 0.5;
    fVar235 = (float)((uint)fVar252 ^ (uint)fStack_748) * 0.0 * 0.0 * 0.5;
    auVar14._4_4_ = fStack_1fc * fVar230;
    auVar14._0_4_ = local_200 * fVar221;
    auVar14._8_4_ = fStack_1f8 * fVar231;
    auVar14._12_4_ = fStack_1f4 * fVar232;
    auVar14._16_4_ = fStack_1f0 * fVar233;
    auVar14._20_4_ = fStack_1ec * fVar234;
    auVar14._24_4_ = fStack_1e8 * fVar235;
    auVar14._28_4_ = (uint)fVar208 ^ uStack_744;
    auVar246._0_4_ = fVar221 * (float)local_500;
    auVar246._4_4_ = fVar230 * local_500._4_4_;
    auVar246._8_4_ = fVar231 * (float)uStack_4f8;
    auVar246._12_4_ = fVar232 * uStack_4f8._4_4_;
    auVar246._16_4_ = fVar233 * (float)uStack_4f0;
    auVar246._20_4_ = fVar234 * uStack_4f0._4_4_;
    auVar246._28_36_ = auVar207._28_36_;
    auVar246._24_4_ = fVar235 * (float)uStack_4e8;
    auVar16._4_4_ = fVar230 * local_520._4_4_;
    auVar16._0_4_ = fVar221 * (float)local_520;
    auVar16._8_4_ = fVar231 * (float)uStack_518;
    auVar16._12_4_ = fVar232 * uStack_518._4_4_;
    auVar16._16_4_ = fVar233 * (float)uStack_510;
    auVar16._20_4_ = fVar234 * uStack_510._4_4_;
    auVar16._24_4_ = fVar235 * (float)uStack_508;
    auVar16._28_4_ = 0x40000000;
    auVar125._4_4_ = fVar230 * local_540._4_4_;
    auVar125._0_4_ = fVar221 * (float)local_540;
    auVar125._8_4_ = fVar231 * (float)uStack_538;
    auVar125._12_4_ = fVar232 * uStack_538._4_4_;
    auVar125._16_4_ = fVar233 * (float)uStack_530;
    auVar125._20_4_ = fVar234 * uStack_530._4_4_;
    auVar125._24_4_ = fVar235 * (float)uStack_528;
    auVar125._28_4_ = uStack_744;
    auVar72._4_4_ = uStack_59c;
    auVar72._0_4_ = local_5a0;
    auVar72._8_4_ = uStack_598;
    auVar72._12_4_ = uStack_594;
    auVar72._16_4_ = uStack_590;
    auVar72._20_4_ = uStack_58c;
    auVar72._24_4_ = uStack_588;
    auVar72._28_4_ = uStack_584;
    auVar110 = vfmadd231ps_fma(auVar14,auVar121,auVar72);
    auVar82._8_8_ = uStack_498;
    auVar82._0_8_ = local_4a0;
    auVar82._16_8_ = uStack_490;
    auVar82._24_8_ = uStack_488;
    auVar109 = vfmadd231ps_fma(auVar246._0_32_,auVar121,auVar82);
    auVar80._8_8_ = uStack_4b8;
    auVar80._0_8_ = local_4c0;
    auVar80._16_8_ = uStack_4b0;
    auVar80._24_8_ = uStack_4a8;
    auVar168 = vfmadd231ps_fma(auVar16,auVar121,auVar80);
    auVar78._8_8_ = uStack_4d8;
    auVar78._0_8_ = local_4e0;
    auVar78._16_8_ = uStack_4d0;
    auVar78._24_8_ = uStack_4c8;
    auVar134 = vfmadd231ps_fma(auVar125,auVar121,auVar78);
    auVar154._4_4_ = fVar248 * fVar248 * (float)((uint)fVar300 ^ uStack_75c) * 0.5;
    auVar154._0_4_ = fVar238 * fVar238 * (float)((uint)fVar220 ^ local_760) * 0.5;
    auVar154._8_4_ = fVar249 * fVar249 * (float)((uint)fVar218 ^ uStack_758) * 0.5;
    auVar154._12_4_ = fVar250 * fVar250 * (float)((uint)fVar219 ^ uStack_754) * 0.5;
    auVar154._16_4_ = fVar106 * fVar106 * fStack_750 * 0.5;
    auVar154._20_4_ = fVar251 * fVar251 * fStack_74c * 0.5;
    auVar154._24_4_ = fVar252 * fVar252 * fStack_748 * 0.5;
    auVar154._28_4_ = auVar299._28_4_;
    auVar263._4_4_ = ((fVar268 + -5.0) * fVar300 * fVar300 + 2.0) * 0.5;
    auVar263._0_4_ = ((fVar253 + -5.0) * fVar220 * fVar220 + 2.0) * 0.5;
    auVar263._8_4_ = ((fVar269 + -5.0) * fVar218 * fVar218 + 2.0) * 0.5;
    auVar263._12_4_ = ((fVar270 + -5.0) * fVar219 * fVar219 + 2.0) * 0.5;
    auVar263._16_4_ = 0x3f800000;
    auVar263._20_4_ = 0x3f800000;
    auVar263._24_4_ = 0x3f800000;
    auVar263._28_4_ = auVar305._28_4_ + 2.0;
    auVar74._4_4_ = uStack_57c;
    auVar74._0_4_ = local_580;
    auVar74._8_4_ = uStack_578;
    auVar74._12_4_ = uStack_574;
    auVar74._16_4_ = uStack_570;
    auVar74._20_4_ = uStack_56c;
    auVar74._24_4_ = uStack_568;
    auVar74._28_4_ = uStack_564;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar263,auVar74);
    auVar93._8_8_ = uStack_1b8;
    auVar93._0_8_ = local_1c0;
    auVar93._16_8_ = uStack_1b0;
    auVar93._24_8_ = uStack_1a8;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar263,auVar93);
    auVar86._8_8_ = uStack_458;
    auVar86._0_8_ = local_460;
    auVar86._16_8_ = uStack_450;
    auVar86._24_8_ = uStack_448;
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar263,auVar86);
    auVar84._8_8_ = uStack_478;
    auVar84._0_8_ = local_480;
    auVar84._16_8_ = uStack_470;
    auVar84._24_8_ = uStack_468;
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar263,auVar84);
    auVar76._4_4_ = uStack_55c;
    auVar76._0_4_ = local_560;
    auVar76._8_4_ = uStack_558;
    auVar76._12_4_ = uStack_554;
    auVar76._16_4_ = uStack_550;
    auVar76._20_4_ = uStack_54c;
    auVar76._24_4_ = uStack_548;
    auVar76._28_4_ = uStack_544;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar154,auVar76);
    auVar94._8_8_ = uStack_198;
    auVar94._0_8_ = local_1a0;
    auVar94._16_8_ = uStack_190;
    auVar94._24_8_ = uStack_188;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar154,auVar94);
    auVar90._8_8_ = uStack_418;
    auVar90._0_8_ = local_420;
    auVar90._16_8_ = uStack_410;
    auVar90._24_8_ = uStack_408;
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar154,auVar90);
    auVar88._8_8_ = uStack_438;
    auVar88._0_8_ = local_440;
    auVar88._16_8_ = uStack_430;
    auVar88._24_8_ = uStack_428;
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar154,auVar88);
    auVar17._4_4_ = (fVar248 + fVar248) * fVar300;
    auVar17._0_4_ = (fVar238 + fVar238) * fVar220;
    auVar17._8_4_ = (fVar249 + fVar249) * fVar218;
    auVar17._12_4_ = (fVar250 + fVar250) * fVar219;
    auVar17._16_4_ = (fVar106 + fVar106) * 0.0;
    auVar17._20_4_ = (fVar251 + fVar251) * 0.0;
    auVar17._24_4_ = (fVar252 + fVar252) * 0.0;
    auVar17._28_4_ = 0;
    auVar121 = vsubps_avx(auVar17,auVar289._0_32_);
    fVar230 = fVar285 + 0.0;
    fVar221 = auVar267._28_4_ + 2.0;
    auVar277._4_4_ = (fVar248 + fVar248) * (fVar268 + 2.0);
    auVar277._0_4_ = (fVar238 + fVar238) * (fVar253 + 2.0);
    auVar277._8_4_ = (fVar249 + fVar249) * (fVar269 + 2.0);
    auVar277._12_4_ = (fVar250 + fVar250) * (fVar270 + 2.0);
    auVar277._16_4_ = (fVar106 + fVar106) * 2.0;
    auVar277._20_4_ = (fVar251 + fVar251) * 2.0;
    auVar277._24_4_ = (fVar252 + fVar252) * 2.0;
    auVar277._28_4_ = fVar221;
    auVar18._4_4_ = fVar248 * fVar248 * 3.0;
    auVar18._0_4_ = fVar238 * fVar238 * 3.0;
    auVar18._8_4_ = fVar249 * fVar249 * 3.0;
    auVar18._12_4_ = fVar250 * fVar250 * 3.0;
    auVar18._16_4_ = fVar106 * fVar106 * 3.0;
    auVar18._20_4_ = fVar251 * fVar251 * 3.0;
    auVar18._24_4_ = fVar252 * fVar252 * 3.0;
    auVar18._28_4_ = fVar208;
    auVar126 = vsubps_avx(auVar277,auVar18);
    auVar122 = vsubps_avx(auVar247._0_32_,auVar17);
    auVar19._4_4_ = auVar121._4_4_ * 0.5;
    auVar19._0_4_ = auVar121._0_4_ * 0.5;
    auVar19._8_4_ = auVar121._8_4_ * 0.5;
    auVar19._12_4_ = auVar121._12_4_ * 0.5;
    auVar19._16_4_ = auVar121._16_4_ * 0.5;
    auVar19._20_4_ = auVar121._20_4_ * 0.5;
    auVar19._24_4_ = auVar121._24_4_ * 0.5;
    auVar19._28_4_ = fVar221;
    auVar244._28_4_ = fVar230;
    auVar244._0_28_ =
         ZEXT1628(CONCAT412(((fVar219 + fVar219) * (fVar270 + -5.0) + fVar270 * fVar219) * 0.5,
                            CONCAT48(((fVar218 + fVar218) * (fVar269 + -5.0) + fVar269 * fVar218) *
                                     0.5,CONCAT44(((fVar300 + fVar300) * (fVar268 + -5.0) +
                                                  fVar268 * fVar300) * 0.5,
                                                  ((fVar220 + fVar220) * (fVar253 + -5.0) +
                                                  fVar253 * fVar220) * 0.5))));
    auVar20._4_4_ = auVar126._4_4_ * 0.5;
    auVar20._0_4_ = auVar126._0_4_ * 0.5;
    auVar20._8_4_ = auVar126._8_4_ * 0.5;
    auVar20._12_4_ = auVar126._12_4_ * 0.5;
    auVar20._16_4_ = auVar126._16_4_ * 0.5;
    auVar20._20_4_ = auVar126._20_4_ * 0.5;
    fVar106 = auVar126._28_4_;
    auVar20._24_4_ = auVar126._24_4_ * 0.5;
    auVar20._28_4_ = fVar106;
    fVar238 = auVar122._0_4_ * 0.5;
    fVar248 = auVar122._4_4_ * 0.5;
    fVar249 = auVar122._8_4_ * 0.5;
    fVar250 = auVar122._12_4_ * 0.5;
    fVar251 = auVar122._16_4_ * 0.5;
    fVar252 = auVar122._20_4_ * 0.5;
    fVar221 = auVar122._24_4_ * 0.5;
    auVar21._4_4_ = fStack_1fc * fVar248;
    auVar21._0_4_ = local_200 * fVar238;
    auVar21._8_4_ = fStack_1f8 * fVar249;
    auVar21._12_4_ = fStack_1f4 * fVar250;
    auVar21._16_4_ = fStack_1f0 * fVar251;
    auVar21._20_4_ = fStack_1ec * fVar252;
    auVar21._24_4_ = fStack_1e8 * fVar221;
    auVar21._28_4_ = fStack_1e4;
    auVar22._4_4_ = fVar248 * local_500._4_4_;
    auVar22._0_4_ = fVar238 * (float)local_500;
    auVar22._8_4_ = fVar249 * (float)uStack_4f8;
    auVar22._12_4_ = fVar250 * uStack_4f8._4_4_;
    auVar22._16_4_ = fVar251 * (float)uStack_4f0;
    auVar22._20_4_ = fVar252 * uStack_4f0._4_4_;
    auVar22._24_4_ = fVar221 * (float)uStack_4e8;
    auVar22._28_4_ = fVar285;
    auVar148._4_4_ = fVar248 * local_520._4_4_;
    auVar148._0_4_ = fVar238 * (float)local_520;
    auVar148._8_4_ = fVar249 * (float)uStack_518;
    auVar148._12_4_ = fVar250 * uStack_518._4_4_;
    auVar148._16_4_ = fVar251 * (float)uStack_510;
    auVar148._20_4_ = fVar252 * uStack_510._4_4_;
    auVar148._24_4_ = fVar221 * (float)uStack_508;
    auVar148._28_4_ = auVar121._28_4_;
    auVar228._4_4_ = fVar248 * local_540._4_4_;
    auVar228._0_4_ = fVar238 * (float)local_540;
    auVar228._8_4_ = fVar249 * (float)uStack_538;
    auVar228._12_4_ = fVar250 * uStack_538._4_4_;
    auVar228._16_4_ = fVar251 * (float)uStack_530;
    auVar228._20_4_ = fVar252 * uStack_530._4_4_;
    auVar228._24_4_ = fVar221 * (float)uStack_528;
    auVar228._28_4_ = auVar122._28_4_;
    auVar73._4_4_ = uStack_59c;
    auVar73._0_4_ = local_5a0;
    auVar73._8_4_ = uStack_598;
    auVar73._12_4_ = uStack_594;
    auVar73._16_4_ = uStack_590;
    auVar73._20_4_ = uStack_58c;
    auVar73._24_4_ = uStack_588;
    auVar73._28_4_ = uStack_584;
    auVar108 = vfmadd231ps_fma(auVar21,auVar20,auVar73);
    auVar83._8_8_ = uStack_498;
    auVar83._0_8_ = local_4a0;
    auVar83._16_8_ = uStack_490;
    auVar83._24_8_ = uStack_488;
    auVar116 = vfmadd231ps_fma(auVar22,auVar20,auVar83);
    auVar81._8_8_ = uStack_4b8;
    auVar81._0_8_ = local_4c0;
    auVar81._16_8_ = uStack_4b0;
    auVar81._24_8_ = uStack_4a8;
    auVar144 = vfmadd231ps_fma(auVar148,auVar20,auVar81);
    auVar79._8_8_ = uStack_4d8;
    auVar79._0_8_ = local_4e0;
    auVar79._16_8_ = uStack_4d0;
    auVar79._24_8_ = uStack_4c8;
    auVar210 = vfmadd231ps_fma(auVar228,auVar20,auVar79);
    auVar75._4_4_ = uStack_57c;
    auVar75._0_4_ = local_580;
    auVar75._8_4_ = uStack_578;
    auVar75._12_4_ = uStack_574;
    auVar75._16_4_ = uStack_570;
    auVar75._20_4_ = uStack_56c;
    auVar75._24_4_ = uStack_568;
    auVar75._28_4_ = uStack_564;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar244,auVar75);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar244,auVar93);
    auVar87._8_8_ = uStack_458;
    auVar87._0_8_ = local_460;
    auVar87._16_8_ = uStack_450;
    auVar87._24_8_ = uStack_448;
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar244,auVar87);
    auVar85._8_8_ = uStack_478;
    auVar85._0_8_ = local_480;
    auVar85._16_8_ = uStack_470;
    auVar85._24_8_ = uStack_468;
    auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar244,auVar85);
    auVar77._4_4_ = uStack_55c;
    auVar77._0_4_ = local_560;
    auVar77._8_4_ = uStack_558;
    auVar77._12_4_ = uStack_554;
    auVar77._16_4_ = uStack_550;
    auVar77._20_4_ = uStack_54c;
    auVar77._24_4_ = uStack_548;
    auVar77._28_4_ = uStack_544;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar19,auVar77);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar19,auVar94);
    auVar91._8_8_ = uStack_418;
    auVar91._0_8_ = local_420;
    auVar91._16_8_ = uStack_410;
    auVar91._24_8_ = uStack_408;
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar19,auVar91);
    auVar89._8_8_ = uStack_438;
    auVar89._0_8_ = local_440;
    auVar89._16_8_ = uStack_430;
    auVar89._24_8_ = uStack_428;
    auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar19,auVar89);
    auVar273._0_4_ = auVar108._0_4_ * fVar105;
    auVar273._4_4_ = auVar108._4_4_ * fVar105;
    auVar273._8_4_ = auVar108._8_4_ * fVar105;
    auVar273._12_4_ = auVar108._12_4_ * fVar105;
    auVar273._16_4_ = fVar105 * 0.0;
    auVar273._20_4_ = fVar105 * 0.0;
    auVar273._24_4_ = fVar105 * 0.0;
    auVar273._28_4_ = 0;
    fVar248 = auVar116._0_4_ * fVar105;
    fVar250 = auVar116._4_4_ * fVar105;
    local_7e0._4_4_ = fVar250;
    local_7e0._0_4_ = fVar248;
    fVar252 = auVar116._8_4_ * fVar105;
    local_7e0._8_4_ = fVar252;
    fVar233 = auVar116._12_4_ * fVar105;
    local_7e0._12_4_ = fVar233;
    local_7e0._16_4_ = fVar105 * 0.0;
    local_7e0._20_4_ = fVar105 * 0.0;
    local_7e0._24_4_ = fVar105 * 0.0;
    local_7e0._28_4_ = fVar208 + fVar208;
    local_ac0._0_4_ = auVar144._0_4_ * fVar105;
    local_ac0._4_4_ = auVar144._4_4_ * fVar105;
    local_ac0._8_4_ = auVar144._8_4_ * fVar105;
    local_ac0._12_4_ = auVar144._12_4_ * fVar105;
    local_ac0._16_4_ = fVar105 * 0.0;
    local_ac0._20_4_ = fVar105 * 0.0;
    local_ac0._24_4_ = fVar105 * 0.0;
    local_ac0._28_4_ = 0;
    fVar208 = fVar105 * auVar210._0_4_;
    fVar231 = fVar105 * auVar210._4_4_;
    auVar276._4_4_ = fVar231;
    auVar276._0_4_ = fVar208;
    fVar218 = fVar105 * auVar210._8_4_;
    auVar276._8_4_ = fVar218;
    fVar219 = fVar105 * auVar210._12_4_;
    auVar276._12_4_ = fVar219;
    auVar276._16_4_ = fVar105 * 0.0;
    auVar276._20_4_ = fVar105 * 0.0;
    auVar276._24_4_ = fVar105 * 0.0;
    auVar276._28_4_ = fVar106;
    auVar148 = ZEXT1632(auVar110);
    auVar19 = vpermps_avx2(_DAT_0205d4a0,auVar148);
    auVar228 = ZEXT1632(auVar109);
    auVar244 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar109));
    local_a40._0_32_ = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar168));
    auVar16 = vsubps_avx(auVar19,ZEXT1632(auVar110));
    auVar125 = vsubps_avx(local_a40._0_32_,ZEXT1632(auVar168));
    fVar238 = auVar125._0_4_;
    fVar249 = auVar125._4_4_;
    auVar281._4_4_ = auVar273._4_4_ * fVar249;
    auVar281._0_4_ = auVar273._0_4_ * fVar238;
    fVar251 = auVar125._8_4_;
    auVar281._8_4_ = auVar273._8_4_ * fVar251;
    fVar221 = auVar125._12_4_;
    auVar281._12_4_ = auVar273._12_4_ * fVar221;
    fVar232 = auVar125._16_4_;
    auVar281._16_4_ = auVar273._16_4_ * fVar232;
    fVar234 = auVar125._20_4_;
    auVar281._20_4_ = auVar273._20_4_ * fVar234;
    fVar220 = auVar125._24_4_;
    auVar281._24_4_ = auVar273._24_4_ * fVar220;
    auVar281._28_4_ = fVar230;
    auVar110 = vfmsub231ps_fma(auVar281,local_ac0,auVar16);
    auVar154 = vsubps_avx(auVar244,auVar228);
    fVar301 = auVar16._0_4_;
    fVar306 = auVar16._4_4_;
    auVar243._4_4_ = fVar306 * fVar250;
    auVar243._0_4_ = fVar301 * fVar248;
    fVar307 = auVar16._8_4_;
    auVar243._8_4_ = fVar307 * fVar252;
    fVar308 = auVar16._12_4_;
    auVar243._12_4_ = fVar308 * fVar233;
    fVar309 = auVar16._16_4_;
    auVar243._16_4_ = fVar309 * fVar105 * 0.0;
    fVar310 = auVar16._20_4_;
    auVar243._20_4_ = fVar310 * fVar105 * 0.0;
    fVar311 = auVar16._24_4_;
    auVar243._24_4_ = fVar311 * fVar105 * 0.0;
    auVar243._28_4_ = auVar19._28_4_;
    auVar109 = vfmsub231ps_fma(auVar243,auVar273,auVar154);
    auVar110 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar109._12_4_ * auVar109._12_4_,
                                                  CONCAT48(auVar109._8_4_ * auVar109._8_4_,
                                                           CONCAT44(auVar109._4_4_ * auVar109._4_4_,
                                                                    auVar109._0_4_ * auVar109._0_4_)
                                                          ))),ZEXT1632(auVar110),ZEXT1632(auVar110))
    ;
    fVar268 = auVar154._0_4_;
    fVar269 = auVar154._4_4_;
    auVar314._4_4_ = fVar269 * local_ac0._4_4_;
    auVar314._0_4_ = fVar268 * (float)local_ac0._0_4_;
    fVar270 = auVar154._8_4_;
    auVar314._8_4_ = fVar270 * local_ac0._8_4_;
    fVar285 = auVar154._12_4_;
    auVar314._12_4_ = fVar285 * local_ac0._12_4_;
    fVar282 = auVar154._16_4_;
    auVar314._16_4_ = fVar282 * local_ac0._16_4_;
    fVar283 = auVar154._20_4_;
    auVar314._20_4_ = fVar283 * local_ac0._20_4_;
    fVar284 = auVar154._24_4_;
    auVar314._24_4_ = fVar284 * local_ac0._24_4_;
    auVar314._28_4_ = auVar244._28_4_;
    auVar108 = vfmsub231ps_fma(auVar314,local_7e0,auVar125);
    auVar237._0_4_ = fVar238 * fVar238;
    auVar237._4_4_ = fVar249 * fVar249;
    auVar237._8_4_ = fVar251 * fVar251;
    auVar237._12_4_ = fVar221 * fVar221;
    auVar237._16_4_ = fVar232 * fVar232;
    auVar237._20_4_ = fVar234 * fVar234;
    auVar237._24_4_ = fVar220 * fVar220;
    auVar237._28_4_ = 0;
    auVar109 = vfmadd231ps_fma(auVar237,auVar154,auVar154);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar16,auVar16);
    auVar121 = vrcpps_avx(ZEXT1632(auVar109));
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar108),ZEXT1632(auVar108));
    auVar149._8_4_ = 0x3f800000;
    auVar149._0_8_ = &DAT_3f8000003f800000;
    auVar149._12_4_ = 0x3f800000;
    auVar149._16_4_ = 0x3f800000;
    auVar149._20_4_ = 0x3f800000;
    auVar149._24_4_ = 0x3f800000;
    auVar149._28_4_ = 0x3f800000;
    auVar110 = vfnmadd213ps_fma(auVar121,ZEXT1632(auVar109),auVar149);
    auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar121,auVar121);
    auVar20 = vpermps_avx2(_DAT_0205d4a0,auVar273);
    local_a60 = vpermps_avx2(_DAT_0205d4a0,local_ac0);
    auVar315._4_4_ = auVar20._4_4_ * fVar249;
    auVar315._0_4_ = auVar20._0_4_ * fVar238;
    auVar315._8_4_ = auVar20._8_4_ * fVar251;
    auVar315._12_4_ = auVar20._12_4_ * fVar221;
    auVar315._16_4_ = auVar20._16_4_ * fVar232;
    auVar315._20_4_ = auVar20._20_4_ * fVar234;
    auVar315._24_4_ = auVar20._24_4_ * fVar220;
    auVar315._28_4_ = auVar121._28_4_;
    auVar116 = vfmsub231ps_fma(auVar315,local_a60,auVar16);
    local_a80 = vpermps_avx2(_DAT_0205d4a0,local_7e0);
    auVar15._4_4_ = fVar306 * local_a80._4_4_;
    auVar15._0_4_ = fVar301 * local_a80._0_4_;
    auVar15._8_4_ = fVar307 * local_a80._8_4_;
    auVar15._12_4_ = fVar308 * local_a80._12_4_;
    auVar15._16_4_ = fVar309 * local_a80._16_4_;
    auVar15._20_4_ = fVar310 * local_a80._20_4_;
    auVar15._24_4_ = fVar311 * local_a80._24_4_;
    auVar15._28_4_ = 0;
    auVar144 = vfmsub231ps_fma(auVar15,auVar20,auVar154);
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar144._12_4_ * auVar144._12_4_,
                                                  CONCAT48(auVar144._8_4_ * auVar144._8_4_,
                                                           CONCAT44(auVar144._4_4_ * auVar144._4_4_,
                                                                    auVar144._0_4_ * auVar144._0_4_)
                                                          ))),ZEXT1632(auVar116),ZEXT1632(auVar116))
    ;
    fVar248 = local_a60._0_4_;
    auVar257._0_4_ = fVar268 * fVar248;
    fVar250 = local_a60._4_4_;
    auVar257._4_4_ = fVar269 * fVar250;
    fVar252 = local_a60._8_4_;
    auVar257._8_4_ = fVar270 * fVar252;
    fVar230 = local_a60._12_4_;
    auVar257._12_4_ = fVar285 * fVar230;
    fVar233 = local_a60._16_4_;
    auVar257._16_4_ = fVar282 * fVar233;
    fVar235 = local_a60._20_4_;
    auVar257._20_4_ = fVar283 * fVar235;
    fVar300 = local_a60._24_4_;
    auVar257._24_4_ = fVar284 * fVar300;
    auVar257._28_4_ = 0;
    auVar144 = vfmsub231ps_fma(auVar257,local_a80,auVar125);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT1632(auVar144),ZEXT1632(auVar144));
    auVar121 = vmaxps_avx(ZEXT1632(CONCAT412(auVar108._12_4_ * auVar110._12_4_,
                                             CONCAT48(auVar108._8_4_ * auVar110._8_4_,
                                                      CONCAT44(auVar108._4_4_ * auVar110._4_4_,
                                                               auVar108._0_4_ * auVar110._0_4_)))),
                          ZEXT1632(CONCAT412(auVar116._12_4_ * auVar110._12_4_,
                                             CONCAT48(auVar116._8_4_ * auVar110._8_4_,
                                                      CONCAT44(auVar116._4_4_ * auVar110._4_4_,
                                                               auVar116._0_4_ * auVar110._0_4_)))));
    auVar258._0_4_ = auVar134._0_4_ + fVar208;
    auVar258._4_4_ = auVar134._4_4_ + fVar231;
    auVar258._8_4_ = auVar134._8_4_ + fVar218;
    auVar258._12_4_ = auVar134._12_4_ + fVar219;
    auVar258._16_4_ = fVar105 * 0.0 + 0.0;
    auVar258._20_4_ = fVar105 * 0.0 + 0.0;
    auVar258._24_4_ = fVar105 * 0.0 + 0.0;
    auVar258._28_4_ = fVar106 + 0.0;
    local_820 = ZEXT1632(auVar134);
    auVar126 = vsubps_avx(local_820,auVar276);
    auVar21 = vpermps_avx2(_DAT_0205d4a0,auVar126);
    auVar22 = vpermps_avx2(_DAT_0205d4a0,local_820);
    auVar126 = vmaxps_avx(local_820,auVar258);
    auVar122 = vmaxps_avx(auVar21,auVar22);
    auVar14 = vrsqrtps_avx(ZEXT1632(auVar109));
    auVar122 = vmaxps_avx(auVar126,auVar122);
    uVar100 = auVar126._28_4_;
    fVar105 = auVar14._0_4_;
    fVar106 = auVar14._4_4_;
    fVar208 = auVar14._8_4_;
    fVar231 = auVar14._12_4_;
    fVar218 = auVar14._16_4_;
    fVar219 = auVar14._20_4_;
    fVar253 = auVar14._24_4_;
    auVar274._0_4_ = fVar105 * fVar105 * fVar105 * auVar109._0_4_ * -0.5;
    auVar274._4_4_ = fVar106 * fVar106 * fVar106 * auVar109._4_4_ * -0.5;
    auVar274._8_4_ = fVar208 * fVar208 * fVar208 * auVar109._8_4_ * -0.5;
    auVar274._12_4_ = fVar231 * fVar231 * fVar231 * auVar109._12_4_ * -0.5;
    auVar274._16_4_ = fVar218 * fVar218 * fVar218 * -0.0;
    auVar274._20_4_ = fVar219 * fVar219 * fVar219 * -0.0;
    auVar274._24_4_ = fVar253 * fVar253 * fVar253 * -0.0;
    auVar274._28_4_ = 0;
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar110 = vfmadd231ps_fma(auVar274,auVar124,auVar14);
    fVar105 = auVar110._0_4_;
    fVar106 = auVar110._4_4_;
    auVar23._4_4_ = fVar269 * fVar106;
    auVar23._0_4_ = fVar268 * fVar105;
    fVar208 = auVar110._8_4_;
    auVar23._8_4_ = fVar270 * fVar208;
    fVar231 = auVar110._12_4_;
    auVar23._12_4_ = fVar285 * fVar231;
    auVar23._16_4_ = fVar282 * 0.0;
    auVar23._20_4_ = fVar283 * 0.0;
    auVar23._24_4_ = fVar284 * 0.0;
    auVar23._28_4_ = uVar100;
    auVar24._4_4_ = (float)local_8e0._4_4_ * fVar106 * fVar249;
    auVar24._0_4_ = (float)local_8e0._0_4_ * fVar105 * fVar238;
    auVar24._8_4_ = fStack_8d8 * fVar208 * fVar251;
    auVar24._12_4_ = fStack_8d4 * fVar231 * fVar221;
    auVar24._16_4_ = fStack_8d0 * fVar232 * 0.0;
    auVar24._20_4_ = fStack_8cc * fVar234 * 0.0;
    auVar24._24_4_ = fStack_8c8 * fVar220 * 0.0;
    auVar24._28_4_ = auVar154._28_4_;
    auVar109 = vfmadd231ps_fma(auVar24,auVar23,_local_8c0);
    auVar299 = ZEXT864(0) << 0x20;
    auVar314 = ZEXT1632(auVar168);
    auVar126 = vsubps_avx(ZEXT832(0) << 0x20,auVar314);
    auVar288 = ZEXT3264(auVar126);
    fVar270 = auVar126._0_4_;
    auVar275._0_4_ = fVar270 * fVar105 * fVar238;
    fVar285 = auVar126._4_4_;
    auVar275._4_4_ = fVar285 * fVar106 * fVar249;
    fVar282 = auVar126._8_4_;
    auVar275._8_4_ = fVar282 * fVar208 * fVar251;
    fVar283 = auVar126._12_4_;
    auVar275._12_4_ = fVar283 * fVar231 * fVar221;
    fVar284 = auVar126._16_4_;
    auVar275._16_4_ = fVar284 * fVar232 * 0.0;
    fVar290 = auVar126._20_4_;
    auVar275._20_4_ = fVar290 * fVar234 * 0.0;
    fVar291 = auVar126._24_4_;
    auVar275._24_4_ = fVar291 * fVar220 * 0.0;
    auVar275._28_4_ = 0;
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,auVar228);
    auVar168 = vfmadd231ps_fma(auVar275,auVar14,auVar23);
    auVar25._4_4_ = fVar306 * fVar106;
    auVar25._0_4_ = fVar301 * fVar105;
    auVar25._8_4_ = fVar307 * fVar208;
    auVar25._12_4_ = fVar308 * fVar231;
    auVar25._16_4_ = fVar309 * 0.0;
    auVar25._20_4_ = fVar310 * 0.0;
    auVar25._24_4_ = fVar311 * 0.0;
    auVar25._28_4_ = uVar100;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar25,_local_880);
    auVar243 = ZEXT832(0) << 0x20;
    auVar263 = vsubps_avx(auVar243,auVar148);
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar263,auVar25);
    auVar26._4_4_ = (float)local_8e0._4_4_ * fVar285;
    auVar26._0_4_ = (float)local_8e0._0_4_ * fVar270;
    auVar26._8_4_ = fStack_8d8 * fVar282;
    auVar26._12_4_ = fStack_8d4 * fVar283;
    auVar26._16_4_ = fStack_8d0 * fVar284;
    auVar26._20_4_ = fStack_8cc * fVar290;
    auVar26._24_4_ = fStack_8c8 * fVar291;
    auVar26._28_4_ = uVar100;
    auVar134 = vfmadd231ps_fma(auVar26,_local_8c0,auVar14);
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),_local_880,auVar263);
    fVar238 = auVar168._0_4_;
    fVar219 = auVar109._0_4_;
    fVar249 = auVar168._4_4_;
    fVar253 = auVar109._4_4_;
    fVar251 = auVar168._8_4_;
    fVar268 = auVar109._8_4_;
    fVar221 = auVar168._12_4_;
    fVar269 = auVar109._12_4_;
    auVar27._28_4_ = uStack_8c4;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar269 * fVar221,
                            CONCAT48(fVar268 * fVar251,CONCAT44(fVar253 * fVar249,fVar219 * fVar238)
                                    )));
    auVar17 = vsubps_avx(ZEXT1632(auVar134),auVar27);
    auVar28._4_4_ = fVar285 * fVar285;
    auVar28._0_4_ = fVar270 * fVar270;
    auVar28._8_4_ = fVar282 * fVar282;
    auVar28._12_4_ = fVar283 * fVar283;
    auVar28._16_4_ = fVar284 * fVar284;
    auVar28._20_4_ = fVar290 * fVar290;
    auVar28._24_4_ = fVar291 * fVar291;
    auVar28._28_4_ = uStack_8c4;
    auVar134 = vfmadd231ps_fma(auVar28,auVar14,auVar14);
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar263,auVar263);
    auVar29._28_4_ = auVar16._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * fVar221,
                            CONCAT48(fVar251 * fVar251,CONCAT44(fVar249 * fVar249,fVar238 * fVar238)
                                    )));
    auVar305 = ZEXT3264(auVar29);
    auVar277 = vsubps_avx(ZEXT1632(auVar134),auVar29);
    auVar126 = vsqrtps_avx(auVar121);
    fVar218 = auVar126._28_4_ + auVar122._28_4_;
    fVar238 = (auVar126._0_4_ + auVar122._0_4_) * 1.0000002;
    fVar249 = (auVar126._4_4_ + auVar122._4_4_) * 1.0000002;
    fVar251 = (auVar126._8_4_ + auVar122._8_4_) * 1.0000002;
    fVar221 = (auVar126._12_4_ + auVar122._12_4_) * 1.0000002;
    fVar232 = (auVar126._16_4_ + auVar122._16_4_) * 1.0000002;
    fVar234 = (auVar126._20_4_ + auVar122._20_4_) * 1.0000002;
    fVar220 = (auVar126._24_4_ + auVar122._24_4_) * 1.0000002;
    auVar30._4_4_ = fVar249 * fVar249;
    auVar30._0_4_ = fVar238 * fVar238;
    auVar30._8_4_ = fVar251 * fVar251;
    auVar30._12_4_ = fVar221 * fVar221;
    auVar30._16_4_ = fVar232 * fVar232;
    auVar30._20_4_ = fVar234 * fVar234;
    auVar30._24_4_ = fVar220 * fVar220;
    auVar30._28_4_ = fVar218;
    auVar259._0_4_ = auVar17._0_4_ + auVar17._0_4_;
    auVar259._4_4_ = auVar17._4_4_ + auVar17._4_4_;
    auVar259._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    auVar259._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    auVar259._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    auVar259._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    auVar259._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    fVar238 = auVar17._28_4_;
    auVar259._28_4_ = fVar238 + fVar238;
    auVar122 = vsubps_avx(auVar277,auVar30);
    auVar246 = ZEXT3264(auVar122);
    auVar281 = ZEXT1632(auVar109);
    auVar315 = ZEXT1632(CONCAT412(fVar269 * fVar269,
                                  CONCAT48(fVar268 * fVar268,
                                           CONCAT44(fVar253 * fVar253,fVar219 * fVar219))));
    auVar17 = vsubps_avx(local_1e0,auVar315);
    auVar31._4_4_ = auVar259._4_4_ * auVar259._4_4_;
    auVar31._0_4_ = auVar259._0_4_ * auVar259._0_4_;
    auVar31._8_4_ = auVar259._8_4_ * auVar259._8_4_;
    auVar31._12_4_ = auVar259._12_4_ * auVar259._12_4_;
    auVar31._16_4_ = auVar259._16_4_ * auVar259._16_4_;
    auVar31._20_4_ = auVar259._20_4_ * auVar259._20_4_;
    auVar31._24_4_ = auVar259._24_4_ * auVar259._24_4_;
    auVar31._28_4_ = fVar218;
    fVar249 = auVar17._0_4_;
    fVar251 = auVar17._4_4_;
    fVar221 = auVar17._8_4_;
    fVar232 = auVar17._12_4_;
    fVar234 = auVar17._16_4_;
    fVar220 = auVar17._20_4_;
    fVar218 = auVar17._24_4_;
    auVar32._4_4_ = fVar251 * 4.0 * auVar122._4_4_;
    auVar32._0_4_ = fVar249 * 4.0 * auVar122._0_4_;
    auVar32._8_4_ = fVar221 * 4.0 * auVar122._8_4_;
    auVar32._12_4_ = fVar232 * 4.0 * auVar122._12_4_;
    auVar32._16_4_ = fVar234 * 4.0 * auVar122._16_4_;
    auVar32._20_4_ = fVar220 * 4.0 * auVar122._20_4_;
    auVar32._24_4_ = fVar218 * 4.0 * auVar122._24_4_;
    auVar32._28_4_ = fVar238;
    auVar18 = vsubps_avx(auVar31,auVar32);
    auVar121 = vcmpps_avx(auVar18,auVar243,5);
    auVar276 = ZEXT1632(auVar168);
    fVar238 = auVar17._28_4_;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0x7f,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar121 >> 0xbf,0) == '\0') &&
        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar121[0x1f])
    {
      local_bc0._8_4_ = 0x7f800000;
      local_bc0._0_8_ = 0x7f8000007f800000;
      local_bc0._12_4_ = 0x7f800000;
      local_bc0._16_4_ = 0x7f800000;
      local_bc0._20_4_ = 0x7f800000;
      local_bc0._24_4_ = 0x7f800000;
      local_bc0._28_4_ = 0x7f800000;
      auVar203._8_4_ = 0xff800000;
      auVar203._0_8_ = 0xff800000ff800000;
      auVar203._12_4_ = 0xff800000;
      auVar203._16_4_ = 0xff800000;
      auVar203._20_4_ = 0xff800000;
      auVar203._24_4_ = 0xff800000;
      auVar203._28_4_ = 0xff800000;
    }
    else {
      auVar243 = vcmpps_avx(auVar18,auVar243,5);
      auVar15 = vsqrtps_avx(auVar18);
      auVar302._0_4_ = fVar249 + fVar249;
      auVar302._4_4_ = fVar251 + fVar251;
      auVar302._8_4_ = fVar221 + fVar221;
      auVar302._12_4_ = fVar232 + fVar232;
      auVar302._16_4_ = fVar234 + fVar234;
      auVar302._20_4_ = fVar220 + fVar220;
      auVar302._24_4_ = fVar218 + fVar218;
      auVar302._28_4_ = fVar238 + fVar238;
      auVar18 = vrcpps_avx(auVar302);
      auVar215._8_4_ = 0x3f800000;
      auVar215._0_8_ = &DAT_3f8000003f800000;
      auVar215._12_4_ = 0x3f800000;
      auVar215._16_4_ = 0x3f800000;
      auVar215._20_4_ = 0x3f800000;
      auVar215._24_4_ = 0x3f800000;
      auVar215._28_4_ = 0x3f800000;
      auVar109 = vfnmadd213ps_fma(auVar302,auVar18,auVar215);
      auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar18,auVar18);
      auVar294._0_4_ = (uint)auVar259._0_4_ ^ local_760;
      auVar294._4_4_ = (uint)auVar259._4_4_ ^ uStack_75c;
      auVar294._8_4_ = (uint)auVar259._8_4_ ^ uStack_758;
      auVar294._12_4_ = (uint)auVar259._12_4_ ^ uStack_754;
      auVar294._16_4_ = (uint)auVar259._16_4_ ^ (uint)fStack_750;
      auVar294._20_4_ = (uint)auVar259._20_4_ ^ (uint)fStack_74c;
      auVar294._24_4_ = (uint)auVar259._24_4_ ^ (uint)fStack_748;
      auVar294._28_4_ = (uint)auVar259._28_4_ ^ uStack_744;
      auVar18 = vsubps_avx(auVar294,auVar15);
      auVar33._4_4_ = auVar18._4_4_ * auVar109._4_4_;
      auVar33._0_4_ = auVar18._0_4_ * auVar109._0_4_;
      auVar33._8_4_ = auVar18._8_4_ * auVar109._8_4_;
      auVar33._12_4_ = auVar18._12_4_ * auVar109._12_4_;
      auVar33._16_4_ = auVar18._16_4_ * 0.0;
      auVar33._20_4_ = auVar18._20_4_ * 0.0;
      auVar33._24_4_ = auVar18._24_4_ * 0.0;
      auVar33._28_4_ = auVar18._28_4_;
      auVar18 = vsubps_avx(auVar15,auVar259);
      auVar34._4_4_ = auVar109._4_4_ * auVar18._4_4_;
      auVar34._0_4_ = auVar109._0_4_ * auVar18._0_4_;
      auVar34._8_4_ = auVar109._8_4_ * auVar18._8_4_;
      auVar34._12_4_ = auVar109._12_4_ * auVar18._12_4_;
      auVar34._16_4_ = auVar18._16_4_ * 0.0;
      auVar34._20_4_ = auVar18._20_4_ * 0.0;
      auVar34._24_4_ = auVar18._24_4_ * 0.0;
      auVar34._28_4_ = auVar18._28_4_;
      auVar109 = vfmadd213ps_fma(auVar281,auVar33,auVar276);
      local_660 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar231,
                                     CONCAT48(auVar109._8_4_ * fVar208,
                                              CONCAT44(auVar109._4_4_ * fVar106,
                                                       auVar109._0_4_ * fVar105))));
      auVar109 = vfmadd213ps_fma(auVar281,auVar34,auVar276);
      local_680 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar231,
                                     CONCAT48(auVar109._8_4_ * fVar208,
                                              CONCAT44(auVar109._4_4_ * fVar106,
                                                       auVar109._0_4_ * fVar105))));
      auVar150._8_4_ = 0x7f800000;
      auVar150._0_8_ = 0x7f8000007f800000;
      auVar150._12_4_ = 0x7f800000;
      auVar150._16_4_ = 0x7f800000;
      auVar150._20_4_ = 0x7f800000;
      auVar150._24_4_ = 0x7f800000;
      auVar150._28_4_ = 0x7f800000;
      local_bc0 = vblendvps_avx(auVar150,auVar33,auVar243);
      auVar67._4_4_ = uStack_8fc;
      auVar67._0_4_ = local_900;
      auVar67._8_4_ = uStack_8f8;
      auVar67._12_4_ = uStack_8f4;
      auVar67._16_4_ = uStack_8f0;
      auVar67._20_4_ = uStack_8ec;
      auVar67._24_4_ = uStack_8e8;
      auVar67._28_4_ = uStack_8e4;
      auVar18 = vandps_avx(auVar315,auVar67);
      auVar18 = vmaxps_avx(local_5c0,auVar18);
      auVar35._4_4_ = auVar18._4_4_ * 1.9073486e-06;
      auVar35._0_4_ = auVar18._0_4_ * 1.9073486e-06;
      auVar35._8_4_ = auVar18._8_4_ * 1.9073486e-06;
      auVar35._12_4_ = auVar18._12_4_ * 1.9073486e-06;
      auVar35._16_4_ = auVar18._16_4_ * 1.9073486e-06;
      auVar35._20_4_ = auVar18._20_4_ * 1.9073486e-06;
      auVar35._24_4_ = auVar18._24_4_ * 1.9073486e-06;
      auVar35._28_4_ = auVar18._28_4_;
      auVar299 = ZEXT3264(auVar35);
      auVar18 = vandps_avx(auVar17,auVar67);
      auVar18 = vcmpps_avx(auVar18,auVar35,1);
      auVar305 = ZEXT3264(auVar18);
      auVar151._8_4_ = 0xff800000;
      auVar151._0_8_ = 0xff800000ff800000;
      auVar151._12_4_ = 0xff800000;
      auVar151._16_4_ = 0xff800000;
      auVar151._20_4_ = 0xff800000;
      auVar151._24_4_ = 0xff800000;
      auVar151._28_4_ = 0xff800000;
      auVar203 = vblendvps_avx(auVar151,auVar34,auVar243);
      auVar15 = auVar243 & auVar18;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar121 = vandps_avx(auVar18,auVar243);
        auVar18 = vcmpps_avx(auVar122,_DAT_02020f00,2);
        auVar246 = ZEXT3264(auVar18);
        auVar131._8_4_ = 0xff800000;
        auVar131._0_8_ = 0xff800000ff800000;
        auVar131._12_4_ = 0xff800000;
        auVar131._16_4_ = 0xff800000;
        auVar131._20_4_ = 0xff800000;
        auVar131._24_4_ = 0xff800000;
        auVar131._28_4_ = 0xff800000;
        auVar167._8_4_ = 0x7f800000;
        auVar167._0_8_ = 0x7f8000007f800000;
        auVar167._12_4_ = 0x7f800000;
        auVar167._16_4_ = 0x7f800000;
        auVar167._20_4_ = 0x7f800000;
        auVar167._24_4_ = 0x7f800000;
        auVar167._28_4_ = 0x7f800000;
        auVar122 = vblendvps_avx(auVar167,auVar131,auVar18);
        auVar109 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar15 = vpmovsxwd_avx2(auVar109);
        auVar299 = ZEXT3264(auVar15);
        local_bc0 = vblendvps_avx(local_bc0,auVar122,auVar15);
        auVar122 = vblendvps_avx(auVar131,auVar167,auVar18);
        auVar305 = ZEXT3264(auVar122);
        auVar203 = vblendvps_avx(auVar203,auVar122,auVar15);
        auVar217._0_8_ = auVar121._0_8_ ^ 0xffffffffffffffff;
        auVar217._8_4_ = auVar121._8_4_ ^ 0xffffffff;
        auVar217._12_4_ = auVar121._12_4_ ^ 0xffffffff;
        auVar217._16_4_ = auVar121._16_4_ ^ 0xffffffff;
        auVar217._20_4_ = auVar121._20_4_ ^ 0xffffffff;
        auVar217._24_4_ = auVar121._24_4_ ^ 0xffffffff;
        auVar217._28_4_ = auVar121._28_4_ ^ 0xffffffff;
        auVar121 = vorps_avx(auVar18,auVar217);
        auVar121 = vandps_avx(auVar243,auVar121);
      }
    }
    auVar267 = ZEXT3264(auVar259);
    auVar122 = local_220 & auVar121;
    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar122 >> 0x7f,0) != '\0') ||
          (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar122 >> 0xbf,0) != '\0') ||
        (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar122[0x1f] < '\0') {
      local_260 = ZEXT1632(auVar110);
      fVar219 = *(float *)(ray + k * 4 + 0x100) - (float)local_960._0_4_;
      auVar242._4_4_ = fVar219;
      auVar242._0_4_ = fVar219;
      auVar242._8_4_ = fVar219;
      auVar242._12_4_ = fVar219;
      auVar242._16_4_ = fVar219;
      auVar242._20_4_ = fVar219;
      auVar242._24_4_ = fVar219;
      auVar242._28_4_ = fVar219;
      auVar18 = vminps_avx(auVar242,auVar203);
      auVar36._4_4_ = fVar285 * local_ac0._4_4_;
      auVar36._0_4_ = fVar270 * (float)local_ac0._0_4_;
      auVar36._8_4_ = fVar282 * local_ac0._8_4_;
      auVar36._12_4_ = fVar283 * local_ac0._12_4_;
      auVar36._16_4_ = fVar284 * local_ac0._16_4_;
      auVar36._20_4_ = fVar290 * local_ac0._20_4_;
      auVar36._24_4_ = fVar291 * local_ac0._24_4_;
      auVar36._28_4_ = fVar219;
      auVar110 = vfmadd213ps_fma(auVar14,local_7e0,auVar36);
      auVar109 = vfmadd213ps_fma(auVar263,auVar273,ZEXT1632(auVar110));
      auVar37._4_4_ = local_ac0._4_4_ * (float)local_8e0._4_4_;
      auVar37._0_4_ = (float)local_ac0._0_4_ * (float)local_8e0._0_4_;
      auVar37._8_4_ = local_ac0._8_4_ * fStack_8d8;
      auVar37._12_4_ = local_ac0._12_4_ * fStack_8d4;
      auVar37._16_4_ = local_ac0._16_4_ * fStack_8d0;
      auVar37._20_4_ = local_ac0._20_4_ * fStack_8cc;
      auVar37._24_4_ = local_ac0._24_4_ * fStack_8c8;
      auVar37._28_4_ = fVar219;
      auVar110 = vfmadd231ps_fma(auVar37,local_7e0,_local_8c0);
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar110),_local_880,auVar273);
      auVar68._4_4_ = uStack_8fc;
      auVar68._0_4_ = local_900;
      auVar68._8_4_ = uStack_8f8;
      auVar68._12_4_ = uStack_8f4;
      auVar68._16_4_ = uStack_8f0;
      auVar68._20_4_ = uStack_8ec;
      auVar68._24_4_ = uStack_8e8;
      auVar68._28_4_ = uStack_8e4;
      auVar122 = vandps_avx(ZEXT1632(auVar168),auVar68);
      auVar152._8_4_ = 0x219392ef;
      auVar152._0_8_ = 0x219392ef219392ef;
      auVar152._12_4_ = 0x219392ef;
      auVar152._16_4_ = 0x219392ef;
      auVar152._20_4_ = 0x219392ef;
      auVar152._24_4_ = 0x219392ef;
      auVar152._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar122,auVar152,1);
      auVar122 = vrcpps_avx(ZEXT1632(auVar168));
      auVar316._8_4_ = 0x3f800000;
      auVar316._0_8_ = &DAT_3f8000003f800000;
      auVar316._12_4_ = 0x3f800000;
      auVar316._16_4_ = 0x3f800000;
      auVar316._20_4_ = 0x3f800000;
      auVar316._24_4_ = 0x3f800000;
      auVar316._28_4_ = 0x3f800000;
      auVar243 = ZEXT1632(auVar168);
      auVar110 = vfnmadd213ps_fma(auVar122,auVar243,auVar316);
      auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar122,auVar122);
      auVar287._0_4_ = auVar168._0_4_ ^ local_760;
      auVar287._4_4_ = auVar168._4_4_ ^ uStack_75c;
      auVar287._8_4_ = auVar168._8_4_ ^ uStack_758;
      auVar287._12_4_ = auVar168._12_4_ ^ uStack_754;
      auVar287._16_4_ = fStack_750;
      auVar287._20_4_ = fStack_74c;
      auVar287._24_4_ = fStack_748;
      auVar287._28_4_ = uStack_744;
      auVar295._0_4_ = auVar110._0_4_ * (float)(auVar109._0_4_ ^ local_760);
      auVar295._4_4_ = auVar110._4_4_ * (float)(auVar109._4_4_ ^ uStack_75c);
      auVar295._8_4_ = auVar110._8_4_ * (float)(auVar109._8_4_ ^ uStack_758);
      auVar295._12_4_ = auVar110._12_4_ * (float)(auVar109._12_4_ ^ uStack_754);
      auVar295._16_4_ = fStack_750 * 0.0;
      auVar295._20_4_ = fStack_74c * 0.0;
      auVar295._24_4_ = fStack_748 * 0.0;
      auVar295._28_4_ = 0;
      auVar122 = vcmpps_avx(auVar243,auVar287,1);
      auVar122 = vorps_avx(auVar14,auVar122);
      auVar303._8_4_ = 0xff800000;
      auVar303._0_8_ = 0xff800000ff800000;
      auVar303._12_4_ = 0xff800000;
      auVar303._16_4_ = 0xff800000;
      auVar303._20_4_ = 0xff800000;
      auVar303._24_4_ = 0xff800000;
      auVar303._28_4_ = 0xff800000;
      auVar122 = vblendvps_avx(auVar295,auVar303,auVar122);
      auVar92._4_4_ = fStack_23c;
      auVar92._0_4_ = local_240;
      auVar92._8_4_ = fStack_238;
      auVar92._12_4_ = fStack_234;
      auVar92._16_4_ = fStack_230;
      auVar92._20_4_ = fStack_22c;
      auVar92._24_4_ = fStack_228;
      auVar92._28_4_ = fStack_224;
      auVar263 = vmaxps_avx(auVar92,local_bc0);
      auVar263 = vmaxps_avx(auVar263,auVar122);
      auVar122 = vcmpps_avx(auVar243,auVar287,6);
      auVar122 = vorps_avx(auVar14,auVar122);
      auVar260._8_4_ = 0x7f800000;
      auVar260._0_8_ = 0x7f8000007f800000;
      auVar260._12_4_ = 0x7f800000;
      auVar260._16_4_ = 0x7f800000;
      auVar260._20_4_ = 0x7f800000;
      auVar260._24_4_ = 0x7f800000;
      auVar260._28_4_ = 0x7f800000;
      auVar122 = vblendvps_avx(auVar295,auVar260,auVar122);
      auVar18 = vminps_avx(auVar18,auVar122);
      auVar122 = vsubps_avx(ZEXT832(0) << 0x20,auVar244);
      auVar14 = vsubps_avx(ZEXT832(0) << 0x20,local_a40._0_32_);
      auVar38._4_4_ = auVar14._4_4_ * fVar250;
      auVar38._0_4_ = auVar14._0_4_ * fVar248;
      auVar38._8_4_ = auVar14._8_4_ * fVar252;
      auVar38._12_4_ = auVar14._12_4_ * fVar230;
      auVar38._16_4_ = auVar14._16_4_ * fVar233;
      auVar38._20_4_ = auVar14._20_4_ * fVar235;
      auVar38._24_4_ = auVar14._24_4_ * fVar300;
      auVar38._28_4_ = auVar14._28_4_;
      auVar110 = vfnmsub231ps_fma(auVar38,local_a80,auVar122);
      auVar122 = vsubps_avx(ZEXT832(0) << 0x20,auVar19);
      auVar109 = vfnmadd231ps_fma(ZEXT1632(auVar110),auVar20,auVar122);
      auVar39._4_4_ = fVar250 * (float)local_8e0._4_4_;
      auVar39._0_4_ = fVar248 * (float)local_8e0._0_4_;
      auVar39._8_4_ = fVar252 * fStack_8d8;
      auVar39._12_4_ = fVar230 * fStack_8d4;
      auVar39._16_4_ = fVar233 * fStack_8d0;
      auVar39._20_4_ = fVar235 * fStack_8cc;
      auVar39._24_4_ = fVar300 * fStack_8c8;
      auVar39._28_4_ = auVar122._28_4_;
      auVar110 = vfnmsub231ps_fma(auVar39,local_a80,_local_8c0);
      auVar168 = vfnmadd231ps_fma(ZEXT1632(auVar110),_local_880,auVar20);
      auVar246 = ZEXT1664(auVar168);
      auVar122 = vandps_avx(ZEXT1632(auVar168),auVar68);
      auVar19 = vrcpps_avx(ZEXT1632(auVar168));
      auVar179._8_4_ = 0x219392ef;
      auVar179._0_8_ = 0x219392ef219392ef;
      auVar179._12_4_ = 0x219392ef;
      auVar179._16_4_ = 0x219392ef;
      auVar179._20_4_ = 0x219392ef;
      auVar179._24_4_ = 0x219392ef;
      auVar179._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar122,auVar179,1);
      auVar288 = ZEXT3264(auVar14);
      auVar244 = ZEXT1632(auVar168);
      auVar110 = vfnmadd213ps_fma(auVar19,auVar244,auVar316);
      auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar19,auVar19);
      auVar296._0_4_ = auVar168._0_4_ ^ local_760;
      auVar296._4_4_ = auVar168._4_4_ ^ uStack_75c;
      auVar296._8_4_ = auVar168._8_4_ ^ uStack_758;
      auVar296._12_4_ = auVar168._12_4_ ^ uStack_754;
      auVar296._16_4_ = fStack_750;
      auVar296._20_4_ = fStack_74c;
      auVar296._24_4_ = fStack_748;
      auVar296._28_4_ = uStack_744;
      auVar299 = ZEXT3264(auVar296);
      auVar40._4_4_ = auVar110._4_4_ * (float)(auVar109._4_4_ ^ uStack_75c);
      auVar40._0_4_ = auVar110._0_4_ * (float)(auVar109._0_4_ ^ local_760);
      auVar40._8_4_ = auVar110._8_4_ * (float)(auVar109._8_4_ ^ uStack_758);
      auVar40._12_4_ = auVar110._12_4_ * (float)(auVar109._12_4_ ^ uStack_754);
      auVar40._16_4_ = fStack_750 * 0.0;
      auVar40._20_4_ = fStack_74c * 0.0;
      auVar40._24_4_ = fStack_748 * 0.0;
      auVar40._28_4_ = uStack_744;
      auVar267 = ZEXT3264(auVar40);
      auVar122 = vcmpps_avx(auVar244,auVar296,1);
      auVar122 = vorps_avx(auVar14,auVar122);
      auVar153._8_4_ = 0xff800000;
      auVar153._0_8_ = 0xff800000ff800000;
      auVar153._12_4_ = 0xff800000;
      auVar153._16_4_ = 0xff800000;
      auVar153._20_4_ = 0xff800000;
      auVar153._24_4_ = 0xff800000;
      auVar153._28_4_ = 0xff800000;
      auVar122 = vblendvps_avx(auVar40,auVar153,auVar122);
      auVar305 = ZEXT3264(auVar122);
      _local_9e0 = vmaxps_avx(auVar263,auVar122);
      auVar122 = vcmpps_avx(auVar244,auVar296,6);
      auVar122 = vorps_avx(auVar14,auVar122);
      auVar204._8_4_ = 0x7f800000;
      auVar204._0_8_ = 0x7f8000007f800000;
      auVar204._12_4_ = 0x7f800000;
      auVar204._16_4_ = 0x7f800000;
      auVar204._20_4_ = 0x7f800000;
      auVar204._24_4_ = 0x7f800000;
      auVar204._28_4_ = 0x7f800000;
      auVar122 = vblendvps_avx(auVar40,auVar204,auVar122);
      auVar121 = vandps_avx(auVar121,local_220);
      local_280 = vminps_avx(auVar18,auVar122);
      auVar122 = vcmpps_avx(_local_9e0,local_280,2);
      auVar14 = auVar121 & auVar122;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar299 = ZEXT3264(auVar316);
        auVar14 = vminps_avx(local_660,auVar316);
        auVar54 = ZEXT812(0);
        auVar207 = ZEXT1264(auVar54) << 0x20;
        auVar14 = vmaxps_avx(auVar14,ZEXT1232(auVar54) << 0x20);
        auVar263 = vminps_avx(local_680,auVar316);
        auVar263 = vmaxps_avx(auVar263,ZEXT1232(auVar54) << 0x20);
        auVar41._4_4_ = (auVar14._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar14._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar14._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar14._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar14._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar14._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar14._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar14._28_4_ + 7.0;
        auVar110 = vfmadd213ps_fma(auVar41,local_800,local_9c0);
        auVar42._4_4_ = (auVar263._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar263._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar263._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar263._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar263._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar263._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar263._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar263._28_4_ + 7.0;
        auVar109 = vfmadd213ps_fma(auVar42,local_800,local_9c0);
        auVar14 = vminps_avx(local_820,auVar258);
        auVar263 = vminps_avx(auVar21,auVar22);
        auVar14 = vminps_avx(auVar14,auVar263);
        auVar126 = vsubps_avx(auVar14,auVar126);
        auVar121 = vandps_avx(auVar122,auVar121);
        local_660 = ZEXT1632(auVar110);
        local_680 = ZEXT1632(auVar109);
        auVar43._4_4_ = auVar126._4_4_ * 0.99999976;
        auVar43._0_4_ = auVar126._0_4_ * 0.99999976;
        auVar43._8_4_ = auVar126._8_4_ * 0.99999976;
        auVar43._12_4_ = auVar126._12_4_ * 0.99999976;
        auVar43._16_4_ = auVar126._16_4_ * 0.99999976;
        auVar43._20_4_ = auVar126._20_4_ * 0.99999976;
        auVar43._24_4_ = auVar126._24_4_ * 0.99999976;
        auVar43._28_4_ = auVar126._28_4_;
        auVar126 = vmaxps_avx(ZEXT832(0) << 0x20,auVar43);
        auVar44._4_4_ = auVar126._4_4_ * auVar126._4_4_;
        auVar44._0_4_ = auVar126._0_4_ * auVar126._0_4_;
        auVar44._8_4_ = auVar126._8_4_ * auVar126._8_4_;
        auVar44._12_4_ = auVar126._12_4_ * auVar126._12_4_;
        auVar44._16_4_ = auVar126._16_4_ * auVar126._16_4_;
        auVar44._20_4_ = auVar126._20_4_ * auVar126._20_4_;
        auVar44._24_4_ = auVar126._24_4_ * auVar126._24_4_;
        auVar44._28_4_ = auVar126._28_4_;
        auVar122 = vsubps_avx(auVar277,auVar44);
        auVar45._4_4_ = auVar122._4_4_ * fVar251 * 4.0;
        auVar45._0_4_ = auVar122._0_4_ * fVar249 * 4.0;
        auVar45._8_4_ = auVar122._8_4_ * fVar221 * 4.0;
        auVar45._12_4_ = auVar122._12_4_ * fVar232 * 4.0;
        auVar45._16_4_ = auVar122._16_4_ * fVar234 * 4.0;
        auVar45._20_4_ = auVar122._20_4_ * fVar220 * 4.0;
        auVar45._24_4_ = auVar122._24_4_ * fVar218 * 4.0;
        auVar45._28_4_ = auVar126._28_4_;
        auVar14 = vsubps_avx(auVar31,auVar45);
        auVar288 = ZEXT3264(auVar14);
        auVar126 = vcmpps_avx(auVar14,ZEXT1232(auVar54) << 0x20,5);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) {
          auVar125 = SUB6432(ZEXT864(0),0) << 0x20;
          local_940 = ZEXT832(0) << 0x20;
          _local_7a0 = ZEXT832(0) << 0x20;
          auVar154 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar245._8_4_ = 0x7f800000;
          auVar245._0_8_ = 0x7f8000007f800000;
          auVar245._12_4_ = 0x7f800000;
          auVar245._16_4_ = 0x7f800000;
          auVar245._20_4_ = 0x7f800000;
          auVar245._24_4_ = 0x7f800000;
          auVar245._28_4_ = 0x7f800000;
          auVar261._8_4_ = 0xff800000;
          auVar261._0_8_ = 0xff800000ff800000;
          auVar261._12_4_ = 0xff800000;
          auVar261._16_4_ = 0xff800000;
          auVar261._20_4_ = 0xff800000;
          auVar261._24_4_ = 0xff800000;
          auVar261._28_4_ = 0xff800000;
          local_920 = local_940;
        }
        else {
          auVar277 = vsqrtps_avx(auVar14);
          auVar262._0_4_ = fVar249 + fVar249;
          auVar262._4_4_ = fVar251 + fVar251;
          auVar262._8_4_ = fVar221 + fVar221;
          auVar262._12_4_ = fVar232 + fVar232;
          auVar262._16_4_ = fVar234 + fVar234;
          auVar262._20_4_ = fVar220 + fVar220;
          auVar262._24_4_ = fVar218 + fVar218;
          auVar262._28_4_ = fVar238 + fVar238;
          auVar263 = vrcpps_avx(auVar262);
          auVar110 = vfnmadd213ps_fma(auVar262,auVar263,auVar316);
          auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar263,auVar263);
          auVar297._0_4_ = (uint)auVar259._0_4_ ^ local_760;
          auVar297._4_4_ = (uint)auVar259._4_4_ ^ uStack_75c;
          auVar297._8_4_ = (uint)auVar259._8_4_ ^ uStack_758;
          auVar297._12_4_ = (uint)auVar259._12_4_ ^ uStack_754;
          auVar297._16_4_ = (uint)auVar259._16_4_ ^ (uint)fStack_750;
          auVar297._20_4_ = (uint)auVar259._20_4_ ^ (uint)fStack_74c;
          auVar297._24_4_ = (uint)auVar259._24_4_ ^ (uint)fStack_748;
          auVar297._28_4_ = (uint)auVar259._28_4_ ^ uStack_744;
          auVar263 = vsubps_avx(auVar297,auVar277);
          auVar18 = vsubps_avx(auVar277,auVar259);
          fVar238 = auVar263._0_4_ * auVar110._0_4_;
          fVar248 = auVar263._4_4_ * auVar110._4_4_;
          auVar46._4_4_ = fVar248;
          auVar46._0_4_ = fVar238;
          fVar249 = auVar263._8_4_ * auVar110._8_4_;
          auVar46._8_4_ = fVar249;
          fVar250 = auVar263._12_4_ * auVar110._12_4_;
          auVar46._12_4_ = fVar250;
          fVar251 = auVar263._16_4_ * 0.0;
          auVar46._16_4_ = fVar251;
          fVar252 = auVar263._20_4_ * 0.0;
          auVar46._20_4_ = fVar252;
          fVar221 = auVar263._24_4_ * 0.0;
          auVar46._24_4_ = fVar221;
          auVar46._28_4_ = auVar277._28_4_;
          fVar230 = auVar18._0_4_ * auVar110._0_4_;
          fVar232 = auVar18._4_4_ * auVar110._4_4_;
          auVar47._4_4_ = fVar232;
          auVar47._0_4_ = fVar230;
          fVar233 = auVar18._8_4_ * auVar110._8_4_;
          auVar47._8_4_ = fVar233;
          fVar234 = auVar18._12_4_ * auVar110._12_4_;
          auVar47._12_4_ = fVar234;
          fVar235 = auVar18._16_4_ * 0.0;
          auVar47._16_4_ = fVar235;
          fVar220 = auVar18._20_4_ * 0.0;
          auVar47._20_4_ = fVar220;
          fVar300 = auVar18._24_4_ * 0.0;
          auVar47._24_4_ = fVar300;
          auVar47._28_4_ = auVar263._28_4_;
          auVar299 = ZEXT3264(auVar47);
          auVar110 = vfmadd213ps_fma(auVar281,auVar46,auVar276);
          auVar109 = vfmadd213ps_fma(auVar281,auVar47,auVar276);
          auVar263 = ZEXT1632(CONCAT412(auVar110._12_4_ * fVar231,
                                        CONCAT48(auVar110._8_4_ * fVar208,
                                                 CONCAT44(auVar110._4_4_ * fVar106,
                                                          auVar110._0_4_ * fVar105))));
          auVar277 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar231,
                                        CONCAT48(auVar109._8_4_ * fVar208,
                                                 CONCAT44(auVar109._4_4_ * fVar106,
                                                          auVar109._0_4_ * fVar105))));
          auVar110 = vfmadd213ps_fma(auVar16,auVar263,auVar148);
          auVar109 = vfmadd213ps_fma(auVar16,auVar277,auVar148);
          auVar168 = vfmadd213ps_fma(auVar154,auVar263,auVar228);
          auVar134 = vfmadd213ps_fma(auVar154,auVar277,auVar228);
          auVar108 = vfmadd213ps_fma(auVar263,auVar125,auVar314);
          auVar116 = vfmadd213ps_fma(auVar125,auVar277,auVar314);
          auVar48._4_4_ = (float)local_880._4_4_ * fVar248;
          auVar48._0_4_ = (float)local_880._0_4_ * fVar238;
          auVar48._8_4_ = fStack_878 * fVar249;
          auVar48._12_4_ = fStack_874 * fVar250;
          auVar48._16_4_ = fStack_870 * fVar251;
          auVar48._20_4_ = fStack_86c * fVar252;
          auVar48._24_4_ = fStack_868 * fVar221;
          auVar48._28_4_ = 0;
          auVar125 = vsubps_avx(auVar48,ZEXT1632(auVar110));
          auVar155._0_4_ = (float)local_8c0._0_4_ * fVar238;
          auVar155._4_4_ = (float)local_8c0._4_4_ * fVar248;
          auVar155._8_4_ = fStack_8b8 * fVar249;
          auVar155._12_4_ = fStack_8b4 * fVar250;
          auVar155._16_4_ = fStack_8b0 * fVar251;
          auVar155._20_4_ = fStack_8ac * fVar252;
          auVar155._24_4_ = fStack_8a8 * fVar221;
          auVar155._28_4_ = 0;
          auVar154 = vsubps_avx(auVar155,ZEXT1632(auVar168));
          auVar180._0_4_ = (float)local_8e0._0_4_ * fVar238;
          auVar180._4_4_ = (float)local_8e0._4_4_ * fVar248;
          auVar180._8_4_ = fStack_8d8 * fVar249;
          auVar180._12_4_ = fStack_8d4 * fVar250;
          auVar180._16_4_ = fStack_8d0 * fVar251;
          auVar180._20_4_ = fStack_8cc * fVar252;
          auVar180._24_4_ = fStack_8c8 * fVar221;
          auVar180._28_4_ = 0;
          auVar16 = vsubps_avx(auVar180,ZEXT1632(auVar108));
          auVar207 = ZEXT3264(auVar16);
          auVar264._0_4_ = (float)local_880._0_4_ * fVar230;
          auVar264._4_4_ = (float)local_880._4_4_ * fVar232;
          auVar264._8_4_ = fStack_878 * fVar233;
          auVar264._12_4_ = fStack_874 * fVar234;
          auVar264._16_4_ = fStack_870 * fVar235;
          auVar264._20_4_ = fStack_86c * fVar220;
          auVar264._24_4_ = fStack_868 * fVar300;
          auVar264._28_4_ = 0;
          local_920 = vsubps_avx(auVar264,ZEXT1632(auVar109));
          auVar49._4_4_ = (float)local_8c0._4_4_ * fVar232;
          auVar49._0_4_ = (float)local_8c0._0_4_ * fVar230;
          auVar49._8_4_ = fStack_8b8 * fVar233;
          auVar49._12_4_ = fStack_8b4 * fVar234;
          auVar49._16_4_ = fStack_8b0 * fVar235;
          auVar49._20_4_ = fStack_8ac * fVar220;
          auVar49._24_4_ = fStack_8a8 * fVar300;
          auVar49._28_4_ = local_920._28_4_;
          local_940 = vsubps_avx(auVar49,ZEXT1632(auVar134));
          auVar50._4_4_ = (float)local_8e0._4_4_ * fVar232;
          auVar50._0_4_ = (float)local_8e0._0_4_ * fVar230;
          auVar50._8_4_ = fStack_8d8 * fVar233;
          auVar50._12_4_ = fStack_8d4 * fVar234;
          auVar50._16_4_ = fStack_8d0 * fVar235;
          auVar50._20_4_ = fStack_8cc * fVar220;
          auVar50._24_4_ = fStack_8c8 * fVar300;
          auVar50._28_4_ = local_940._28_4_;
          _local_7a0 = vsubps_avx(auVar50,ZEXT1632(auVar116));
          auVar305 = ZEXT864(0) << 0x20;
          auVar16 = vcmpps_avx(auVar14,_DAT_02020f00,5);
          auVar265._8_4_ = 0x7f800000;
          auVar265._0_8_ = 0x7f8000007f800000;
          auVar265._12_4_ = 0x7f800000;
          auVar265._16_4_ = 0x7f800000;
          auVar265._20_4_ = 0x7f800000;
          auVar265._24_4_ = 0x7f800000;
          auVar265._28_4_ = 0x7f800000;
          auVar245 = vblendvps_avx(auVar265,auVar46,auVar16);
          auVar69._4_4_ = uStack_8fc;
          auVar69._0_4_ = local_900;
          auVar69._8_4_ = uStack_8f8;
          auVar69._12_4_ = uStack_8f4;
          auVar69._16_4_ = uStack_8f0;
          auVar69._20_4_ = uStack_8ec;
          auVar69._24_4_ = uStack_8e8;
          auVar69._28_4_ = uStack_8e4;
          auVar14 = vandps_avx(auVar69,auVar315);
          auVar14 = vmaxps_avx(local_5c0,auVar14);
          auVar288 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar51._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar51._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar51._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar51._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar51._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar51._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar51._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar51._28_4_ = auVar14._28_4_;
          auVar14 = vandps_avx(auVar69,auVar17);
          auVar14 = vcmpps_avx(auVar14,auVar51,1);
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
          auVar261 = vblendvps_avx(auVar266,auVar47,auVar16);
          auVar263 = auVar16 & auVar14;
          if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar263 >> 0x7f,0) != '\0') ||
                (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar263 >> 0xbf,0) != '\0') ||
              (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar263[0x1f] < '\0') {
            auVar126 = vandps_avx(auVar14,auVar16);
            auVar14 = vcmpps_avx(auVar122,ZEXT832(0) << 0x20,2);
            auVar298._8_4_ = 0xff800000;
            auVar298._0_8_ = 0xff800000ff800000;
            auVar298._12_4_ = 0xff800000;
            auVar298._16_4_ = 0xff800000;
            auVar298._20_4_ = 0xff800000;
            auVar298._24_4_ = 0xff800000;
            auVar298._28_4_ = 0xff800000;
            auVar299 = ZEXT3264(auVar298);
            auVar304._8_4_ = 0x7f800000;
            auVar304._0_8_ = 0x7f8000007f800000;
            auVar304._12_4_ = 0x7f800000;
            auVar304._16_4_ = 0x7f800000;
            auVar304._20_4_ = 0x7f800000;
            auVar304._24_4_ = 0x7f800000;
            auVar304._28_4_ = 0x7f800000;
            auVar305 = ZEXT3264(auVar304);
            auVar122 = vblendvps_avx(auVar304,auVar298,auVar14);
            auVar110 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
            auVar263 = vpmovsxwd_avx2(auVar110);
            auVar245 = vblendvps_avx(auVar245,auVar122,auVar263);
            auVar122 = vblendvps_avx(auVar298,auVar304,auVar14);
            auVar288 = ZEXT3264(auVar122);
            auVar261 = vblendvps_avx(auVar261,auVar122,auVar263);
            auVar229._0_8_ = auVar126._0_8_ ^ 0xffffffffffffffff;
            auVar229._8_4_ = auVar126._8_4_ ^ 0xffffffff;
            auVar229._12_4_ = auVar126._12_4_ ^ 0xffffffff;
            auVar229._16_4_ = auVar126._16_4_ ^ 0xffffffff;
            auVar229._20_4_ = auVar126._20_4_ ^ 0xffffffff;
            auVar229._24_4_ = auVar126._24_4_ ^ 0xffffffff;
            auVar229._28_4_ = auVar126._28_4_ ^ 0xffffffff;
            auVar126 = vorps_avx(auVar14,auVar229);
            auVar126 = vandps_avx(auVar16,auVar126);
          }
        }
        local_400 = _local_9e0;
        local_3e0 = vminps_avx(local_280,auVar245);
        auVar14 = vmaxps_avx(_local_9e0,auVar261);
        auVar267 = ZEXT3264(auVar14);
        _local_2a0 = auVar14;
        auVar122 = vcmpps_avx(_local_9e0,local_3e0,2);
        local_6a0 = vandps_avx(auVar122,auVar121);
        auVar122 = vcmpps_avx(auVar14,local_280,2);
        local_740 = vandps_avx(auVar122,auVar121);
        auVar246 = ZEXT3264(local_740);
        auVar121 = vorps_avx(local_740,local_6a0);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          local_6e0._0_8_ = auVar126._0_8_ ^ 0xffffffffffffffff;
          local_6e0._8_4_ = auVar126._8_4_ ^ 0xffffffff;
          local_6e0._12_4_ = auVar126._12_4_ ^ 0xffffffff;
          local_6e0._16_4_ = auVar126._16_4_ ^ 0xffffffff;
          local_6e0._20_4_ = auVar126._20_4_ ^ 0xffffffff;
          local_6e0._24_4_ = auVar126._24_4_ ^ 0xffffffff;
          local_6e0._28_4_ = auVar126._28_4_ ^ 0xffffffff;
          auVar267._0_4_ = auVar207._0_4_ * (float)local_8e0._0_4_;
          auVar267._4_4_ = auVar207._4_4_ * (float)local_8e0._4_4_;
          auVar267._8_4_ = auVar207._8_4_ * fStack_8d8;
          auVar267._12_4_ = auVar207._12_4_ * fStack_8d4;
          auVar267._16_4_ = auVar207._16_4_ * fStack_8d0;
          auVar267._20_4_ = auVar207._20_4_ * fStack_8cc;
          auVar267._28_36_ = auVar207._28_36_;
          auVar267._24_4_ = auVar207._24_4_ * fStack_8c8;
          auVar110 = vfmadd132ps_fma(auVar154,auVar267._0_32_,_local_8c0);
          auVar110 = vfmadd132ps_fma(auVar125,ZEXT1632(auVar110),_local_880);
          auVar70._4_4_ = uStack_8fc;
          auVar70._0_4_ = local_900;
          auVar70._8_4_ = uStack_8f8;
          auVar70._12_4_ = uStack_8f4;
          auVar70._16_4_ = uStack_8f0;
          auVar70._20_4_ = uStack_8ec;
          auVar70._24_4_ = uStack_8e8;
          auVar70._28_4_ = uStack_8e4;
          auVar121 = vandps_avx(ZEXT1632(auVar110),auVar70);
          auVar156._8_4_ = 0x3e99999a;
          auVar156._0_8_ = 0x3e99999a3e99999a;
          auVar156._12_4_ = 0x3e99999a;
          auVar156._16_4_ = 0x3e99999a;
          auVar156._20_4_ = 0x3e99999a;
          auVar156._24_4_ = 0x3e99999a;
          auVar156._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar156,1);
          auVar121 = vorps_avx(auVar121,local_6e0);
          auVar157._8_4_ = 3;
          auVar157._0_8_ = 0x300000003;
          auVar157._12_4_ = 3;
          auVar157._16_4_ = 3;
          auVar157._20_4_ = 3;
          auVar157._24_4_ = 3;
          auVar157._28_4_ = 3;
          auVar181._8_4_ = 2;
          auVar181._0_8_ = 0x200000002;
          auVar181._12_4_ = 2;
          auVar181._16_4_ = 2;
          auVar181._20_4_ = 2;
          auVar181._24_4_ = 2;
          auVar181._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar181,auVar157,auVar121);
          uVar100 = (undefined4)uVar101;
          local_700._4_4_ = uVar100;
          local_700._0_4_ = uVar100;
          local_700._8_4_ = uVar100;
          local_700._12_4_ = uVar100;
          local_700._16_4_ = uVar100;
          local_700._20_4_ = uVar100;
          local_700._24_4_ = uVar100;
          local_700._28_4_ = uVar100;
          local_7c0 = vpcmpgtd_avx2(auVar121,local_700);
          auVar121 = vpandn_avx2(local_7c0,local_6a0);
          auVar126 = local_6a0 & ~local_7c0;
          auStack_778 = auVar21._8_24_;
          local_780 = uVar101;
          fStack_b2c = auVar10._4_4_;
          fStack_b28 = auVar10._8_4_;
          fStack_b24 = auVar10._12_4_;
          local_720 = auVar121;
          local_6c0 = local_740;
          auVar110 = (undefined1  [16])0x0;
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0x7f,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0xbf,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar126[0x1f] < '\0') {
            auVar109 = vminps_avx(auVar11,auVar13);
            auVar110 = vmaxps_avx(auVar11,auVar13);
            auVar168 = vminps_avx(auVar12,auVar10);
            auVar134 = vminps_avx(auVar109,auVar168);
            auVar109 = vmaxps_avx(auVar12,auVar10);
            auVar168 = vmaxps_avx(auVar110,auVar109);
            auVar110 = vandps_avx(auVar134,local_a00);
            auVar109 = vandps_avx(auVar168,local_a00);
            auVar110 = vmaxps_avx(auVar110,auVar109);
            auVar109 = vmovshdup_avx(auVar110);
            auVar109 = vmaxss_avx(auVar109,auVar110);
            auVar110 = vshufpd_avx(auVar110,auVar110,1);
            auVar110 = vmaxss_avx(auVar110,auVar109);
            local_a40._0_4_ = auVar110._0_4_ * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar168,auVar168,0xff);
            local_860._16_16_ = auVar258._16_16_;
            local_8a0._4_4_ = (float)local_9e0._4_4_ + (float)local_840._4_4_;
            local_8a0._0_4_ = (float)local_9e0._0_4_ + (float)local_840._0_4_;
            fStack_898 = fStack_9d8 + fStack_838;
            fStack_894 = fStack_9d4 + fStack_834;
            fStack_890 = fStack_9d0 + fStack_830;
            fStack_88c = fStack_9cc + fStack_82c;
            fStack_888 = fStack_9c8 + fStack_828;
            fStack_884 = fStack_9c4 + fStack_824;
            do {
              auVar158._8_4_ = 0x7f800000;
              auVar158._0_8_ = 0x7f8000007f800000;
              auVar158._12_4_ = 0x7f800000;
              auVar158._16_4_ = 0x7f800000;
              auVar158._20_4_ = 0x7f800000;
              auVar158._24_4_ = 0x7f800000;
              auVar158._28_4_ = 0x7f800000;
              auVar126 = vblendvps_avx(auVar158,_local_9e0,auVar121);
              auVar122 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar122 = vminps_avx(auVar126,auVar122);
              auVar16 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar16);
              auVar16 = vpermpd_avx2(auVar122,0x4e);
              auVar122 = vminps_avx(auVar122,auVar16);
              auVar122 = vcmpps_avx(auVar126,auVar122,0);
              auVar16 = auVar121 & auVar122;
              auVar126 = auVar121;
              if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar16 >> 0x7f,0) != '\0') ||
                    (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0xbf,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar16[0x1f] < '\0') {
                auVar126 = vandps_avx(auVar122,auVar121);
              }
              uVar97 = vmovmskps_avx(auVar126);
              iVar96 = 0;
              for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
                iVar96 = iVar96 + 1;
              }
              uVar97 = iVar96 << 2;
              local_720 = auVar121;
              *(undefined4 *)(local_720 + uVar97) = 0;
              fVar238 = *(float *)(local_660 + uVar97);
              uVar97 = *(uint *)(local_400 + uVar97);
              fVar248 = auVar8._0_4_;
              if ((float)local_a10._0_4_ < 0.0) {
                fVar248 = sqrtf((float)local_a10._0_4_);
              }
              auVar288 = ZEXT464(uVar97);
              local_a80._0_4_ = fVar248 * 1.9073486e-06;
              lVar102 = 4;
              do {
                fVar248 = auVar288._0_4_;
                auVar111._4_4_ = fVar248;
                auVar111._0_4_ = fVar248;
                auVar111._8_4_ = fVar248;
                auVar111._12_4_ = fVar248;
                auVar109 = vfmadd213ps_fma(auVar111,local_9f0,_DAT_01feba10);
                fVar251 = 1.0 - fVar238;
                auVar116 = SUB6416(ZEXT464(0x40400000),0);
                auVar108 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar144 = ZEXT416((uint)fVar238);
                auVar168 = vfmadd213ss_fma(auVar116,auVar144,auVar108);
                auVar110 = vfmadd213ss_fma(auVar168,ZEXT416((uint)(fVar238 * fVar238)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar134 = vfmadd213ss_fma(auVar116,ZEXT416((uint)fVar251),auVar108);
                auVar134 = vfmadd213ss_fma(auVar134,ZEXT416((uint)(fVar251 * fVar251)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar105 = fVar251 * fVar251 * -fVar238 * 0.5;
                fVar249 = auVar110._0_4_ * 0.5;
                fVar250 = auVar134._0_4_ * 0.5;
                fVar106 = fVar238 * fVar238 * -fVar251 * 0.5;
                auVar187._0_4_ = fVar106 * fVar132;
                auVar187._4_4_ = fVar106 * fStack_b2c;
                auVar187._8_4_ = fVar106 * fStack_b28;
                auVar187._12_4_ = fVar106 * fStack_b24;
                auVar211._4_4_ = fVar250;
                auVar211._0_4_ = fVar250;
                auVar211._8_4_ = fVar250;
                auVar211._12_4_ = fVar250;
                auVar110 = vfmadd132ps_fma(auVar211,auVar187,auVar12);
                auVar169._4_4_ = fVar249;
                auVar169._0_4_ = fVar249;
                auVar169._8_4_ = fVar249;
                auVar169._12_4_ = fVar249;
                auVar110 = vfmadd132ps_fma(auVar169,auVar110,auVar13);
                auVar188._4_4_ = fVar105;
                auVar188._0_4_ = fVar105;
                auVar188._8_4_ = fVar105;
                auVar188._12_4_ = fVar105;
                auVar110 = vfmadd132ps_fma(auVar188,auVar110,auVar11);
                auVar108 = vfmadd231ss_fma(auVar108,auVar144,ZEXT416(0x41100000));
                auVar134 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar144,
                                           ZEXT416(0x40800000));
                local_ac0._0_16_ = auVar134;
                local_7e0._0_16_ = auVar110;
                auVar109 = vsubps_avx(auVar109,auVar110);
                auVar110 = vdpps_avx(auVar109,auVar109,0x7f);
                auVar134 = vfmadd213ss_fma(auVar116,auVar144,ZEXT416(0xbf800000));
                fVar105 = auVar110._0_4_;
                if (fVar105 < 0.0) {
                  local_a60._0_4_ = auVar168._0_4_;
                  local_9c0._0_4_ = fVar251 * -2.0;
                  auVar305._0_4_ = sqrtf(fVar105);
                  auVar305._4_60_ = extraout_var;
                  auVar168 = ZEXT416((uint)local_a60._0_4_);
                  auVar116 = auVar305._0_16_;
                  fVar249 = (float)local_9c0._0_4_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar110,auVar110);
                  fVar249 = fVar251 * -2.0;
                }
                auVar168 = vfmadd213ss_fma(auVar168,ZEXT416((uint)(fVar238 + fVar238)),
                                           ZEXT416((uint)(fVar238 * fVar238 * 3.0)));
                auVar209 = SUB6416(ZEXT464(0x40000000),0);
                auVar210 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar144,auVar209);
                auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -3.0)),
                                           ZEXT416((uint)(fVar251 + fVar251)),auVar210);
                auVar133 = vfnmadd231ss_fma(ZEXT416((uint)(fVar238 * (fVar251 + fVar251))),
                                            ZEXT416((uint)fVar251),ZEXT416((uint)fVar251));
                auVar210 = vfmadd213ss_fma(ZEXT416((uint)fVar249),auVar144,
                                           ZEXT416((uint)(fVar238 * fVar238)));
                fVar249 = auVar133._0_4_ * 0.5;
                fVar250 = auVar168._0_4_ * 0.5;
                fVar106 = auVar107._0_4_ * 0.5;
                fVar251 = auVar210._0_4_ * 0.5;
                auVar189._0_4_ = fVar132 * fVar251;
                auVar189._4_4_ = fStack_b2c * fVar251;
                auVar189._8_4_ = fStack_b28 * fVar251;
                auVar189._12_4_ = fStack_b24 * fVar251;
                auVar170._4_4_ = fVar106;
                auVar170._0_4_ = fVar106;
                auVar170._8_4_ = fVar106;
                auVar170._12_4_ = fVar106;
                auVar168 = vfmadd213ps_fma(auVar170,auVar12,auVar189);
                auVar135._4_4_ = fVar250;
                auVar135._0_4_ = fVar250;
                auVar135._8_4_ = fVar250;
                auVar135._12_4_ = fVar250;
                auVar168 = vfmadd213ps_fma(auVar135,auVar13,auVar168);
                auVar292._4_4_ = fVar249;
                auVar292._0_4_ = fVar249;
                auVar292._8_4_ = fVar249;
                auVar292._12_4_ = fVar249;
                auVar210 = vfmadd213ps_fma(auVar292,auVar11,auVar168);
                auVar144 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar144,auVar209);
                local_ba0 = auVar134._0_4_;
                auVar112._0_4_ = fVar132 * local_ba0;
                auVar112._4_4_ = fStack_b2c * local_ba0;
                auVar112._8_4_ = fStack_b28 * local_ba0;
                auVar112._12_4_ = fStack_b24 * local_ba0;
                auVar171._4_4_ = local_ac0._0_4_;
                auVar171._0_4_ = local_ac0._0_4_;
                auVar171._8_4_ = local_ac0._0_4_;
                auVar171._12_4_ = local_ac0._0_4_;
                auVar168 = vfmadd213ps_fma(auVar171,auVar12,auVar112);
                uVar100 = auVar108._0_4_;
                auVar190._4_4_ = uVar100;
                auVar190._0_4_ = uVar100;
                auVar190._8_4_ = uVar100;
                auVar190._12_4_ = uVar100;
                auVar168 = vfmadd213ps_fma(auVar190,auVar13,auVar168);
                auVar134 = vdpps_avx(auVar210,auVar210,0x7f);
                auVar136._0_4_ = auVar144._0_4_;
                auVar136._4_4_ = auVar136._0_4_;
                auVar136._8_4_ = auVar136._0_4_;
                auVar136._12_4_ = auVar136._0_4_;
                auVar144 = vfmadd213ps_fma(auVar136,auVar11,auVar168);
                auVar168 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar108 = vrsqrtss_avx(auVar168,auVar168);
                fVar106 = auVar134._0_4_;
                fVar249 = auVar108._0_4_;
                auVar108 = vdpps_avx(auVar210,auVar144,0x7f);
                fVar249 = fVar249 * 1.5 + fVar106 * -0.5 * fVar249 * fVar249 * fVar249;
                auVar137._0_4_ = auVar144._0_4_ * fVar106;
                auVar137._4_4_ = auVar144._4_4_ * fVar106;
                auVar137._8_4_ = auVar144._8_4_ * fVar106;
                auVar137._12_4_ = auVar144._12_4_ * fVar106;
                fVar250 = auVar108._0_4_;
                auVar226._0_4_ = auVar210._0_4_ * fVar250;
                auVar226._4_4_ = auVar210._4_4_ * fVar250;
                fVar251 = auVar210._8_4_;
                auVar226._8_4_ = fVar251 * fVar250;
                fVar252 = auVar210._12_4_;
                auVar226._12_4_ = fVar252 * fVar250;
                auVar108 = vsubps_avx(auVar137,auVar226);
                auVar168 = vrcpss_avx(auVar168,auVar168);
                auVar144 = vfnmadd213ss_fma(auVar168,auVar134,auVar209);
                fVar250 = auVar168._0_4_ * auVar144._0_4_;
                auVar168 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                      ZEXT416((uint)(fVar248 * (float)local_a80._0_4_)));
                local_a60._0_8_ = auVar210._0_8_ ^ 0x8000000080000000;
                local_a60._8_4_ = -fVar251;
                local_a60._12_4_ = -fVar252;
                auVar191._0_4_ = fVar249 * auVar108._0_4_ * fVar250;
                auVar191._4_4_ = fVar249 * auVar108._4_4_ * fVar250;
                auVar191._8_4_ = fVar249 * auVar108._8_4_ * fVar250;
                auVar191._12_4_ = fVar249 * auVar108._12_4_ * fVar250;
                auVar240._0_4_ = auVar210._0_4_ * fVar249;
                auVar240._4_4_ = auVar210._4_4_ * fVar249;
                auVar240._8_4_ = fVar251 * fVar249;
                auVar240._12_4_ = fVar252 * fVar249;
                local_ac0._0_4_ = auVar168._0_4_;
                if (fVar106 < -fVar106) {
                  fVar249 = sqrtf(fVar106);
                  auVar168 = ZEXT416((uint)local_ac0._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                }
                else {
                  auVar134 = vsqrtss_avx(auVar134,auVar134);
                  fVar249 = auVar134._0_4_;
                }
                auVar134 = vdpps_avx(auVar109,auVar240,0x7f);
                auVar133 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar116,auVar168);
                auVar108 = vdpps_avx(local_a60._0_16_,auVar240,0x7f);
                auVar144 = vdpps_avx(auVar109,auVar191,0x7f);
                auVar107 = vdpps_avx(local_9f0,auVar240,0x7f);
                auVar133 = vfmadd213ss_fma(ZEXT416((uint)(auVar116._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a40._0_4_ / fVar249)),
                                           auVar133);
                auVar305 = ZEXT1664(auVar133);
                fVar249 = auVar108._0_4_ + auVar144._0_4_;
                auVar113._0_4_ = auVar134._0_4_ * auVar134._0_4_;
                auVar113._4_4_ = auVar134._4_4_ * auVar134._4_4_;
                auVar113._8_4_ = auVar134._8_4_ * auVar134._8_4_;
                auVar113._12_4_ = auVar134._12_4_ * auVar134._12_4_;
                auVar108 = vdpps_avx(auVar109,local_a60._0_16_,0x7f);
                auVar144 = vsubps_avx(auVar110,auVar113);
                auVar116 = vrsqrtss_avx(auVar144,auVar144);
                fVar106 = auVar144._0_4_;
                fVar250 = auVar116._0_4_;
                fVar250 = fVar250 * 1.5 + fVar106 * -0.5 * fVar250 * fVar250 * fVar250;
                auVar116 = vdpps_avx(auVar109,local_9f0,0x7f);
                local_a60._0_16_ = vfnmadd231ss_fma(auVar108,auVar134,ZEXT416((uint)fVar249));
                auVar108 = vfnmadd231ss_fma(auVar116,auVar134,auVar107);
                if (fVar106 < 0.0) {
                  local_9c0._0_16_ = ZEXT416((uint)fVar249);
                  local_800._0_4_ = fVar250;
                  local_820._0_16_ = auVar108;
                  fVar106 = sqrtf(fVar106);
                  auVar305 = ZEXT464(auVar133._0_4_);
                  auVar168 = ZEXT416((uint)local_ac0._0_4_);
                  fVar250 = (float)local_800._0_4_;
                  auVar108 = local_820._0_16_;
                  auVar116 = local_9c0._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar144,auVar144);
                  fVar106 = auVar116._0_4_;
                  auVar116 = ZEXT416((uint)fVar249);
                }
                auVar299 = ZEXT1664(auVar134);
                auVar144 = vpermilps_avx(local_7e0._0_16_,0xff);
                auVar133 = vshufps_avx(auVar210,auVar210,0xff);
                auVar209 = vfmsub213ss_fma(local_a60._0_16_,ZEXT416((uint)fVar250),auVar133);
                auVar246 = ZEXT1664(auVar209);
                auVar192._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
                auVar192._8_4_ = auVar107._8_4_ ^ 0x80000000;
                auVar192._12_4_ = auVar107._12_4_ ^ 0x80000000;
                auVar212._0_8_ = auVar209._0_8_ ^ 0x8000000080000000;
                auVar212._8_4_ = auVar209._8_4_ ^ 0x80000000;
                auVar212._12_4_ = auVar209._12_4_ ^ 0x80000000;
                auVar108 = ZEXT416((uint)(auVar108._0_4_ * fVar250));
                auVar107 = vfmsub231ss_fma(ZEXT416((uint)(auVar107._0_4_ * auVar209._0_4_)),auVar116
                                           ,auVar108);
                auVar108 = vinsertps_avx(auVar108,auVar192,0x10);
                uVar100 = auVar107._0_4_;
                auVar193._4_4_ = uVar100;
                auVar193._0_4_ = uVar100;
                auVar193._8_4_ = uVar100;
                auVar193._12_4_ = uVar100;
                auVar108 = vdivps_avx(auVar108,auVar193);
                auVar107 = ZEXT416((uint)(fVar106 - auVar144._0_4_));
                auVar144 = vinsertps_avx(auVar134,auVar107,0x10);
                auVar172._0_4_ = auVar144._0_4_ * auVar108._0_4_;
                auVar172._4_4_ = auVar144._4_4_ * auVar108._4_4_;
                auVar172._8_4_ = auVar144._8_4_ * auVar108._8_4_;
                auVar172._12_4_ = auVar144._12_4_ * auVar108._12_4_;
                auVar108 = vinsertps_avx(auVar212,auVar116,0x1c);
                auVar108 = vdivps_avx(auVar108,auVar193);
                auVar194._0_4_ = auVar144._0_4_ * auVar108._0_4_;
                auVar194._4_4_ = auVar144._4_4_ * auVar108._4_4_;
                auVar194._8_4_ = auVar144._8_4_ * auVar108._8_4_;
                auVar194._12_4_ = auVar144._12_4_ * auVar108._12_4_;
                auVar108 = vhaddps_avx(auVar172,auVar172);
                auVar116 = vhaddps_avx(auVar194,auVar194);
                fVar238 = fVar238 - auVar108._0_4_;
                fVar248 = fVar248 - auVar116._0_4_;
                auVar288 = ZEXT464((uint)fVar248);
                auVar108 = vandps_avx(auVar134,local_a00);
                if (auVar305._0_4_ <= auVar108._0_4_) {
LAB_016becab:
                  bVar53 = false;
                }
                else {
                  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(auVar168._0_4_ + auVar305._0_4_)),
                                             local_860._0_16_,ZEXT416(0x36000000));
                  auVar168 = vandps_avx(auVar107,local_a00);
                  if (auVar108._0_4_ <= auVar168._0_4_) goto LAB_016becab;
                  fVar248 = fVar248 + (float)local_960._0_4_;
                  auVar288 = ZEXT464((uint)fVar248);
                  bVar53 = true;
                  if ((((fVar104 <= fVar248) &&
                       (fVar249 = *(float *)(ray + k * 4 + 0x100), fVar248 <= fVar249)) &&
                      (0.0 <= fVar238)) && (fVar238 <= 1.0)) {
                    auVar110 = vrsqrtss_avx(auVar110,auVar110);
                    fVar250 = auVar110._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar95].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar105 = fVar250 * 1.5 + fVar105 * -0.5 * fVar250 * fVar250 * fVar250;
                      local_b60 = auVar109._0_4_;
                      fStack_b5c = auVar109._4_4_;
                      fStack_b58 = auVar109._8_4_;
                      fStack_b54 = auVar109._12_4_;
                      auVar138._0_4_ = fVar105 * local_b60;
                      auVar138._4_4_ = fVar105 * fStack_b5c;
                      auVar138._8_4_ = fVar105 * fStack_b58;
                      auVar138._12_4_ = fVar105 * fStack_b54;
                      auVar108 = vfmadd213ps_fma(auVar133,auVar138,auVar210);
                      auVar110 = vshufps_avx(auVar138,auVar138,0xc9);
                      auVar109 = vshufps_avx(auVar210,auVar210,0xc9);
                      auVar139._0_4_ = auVar138._0_4_ * auVar109._0_4_;
                      auVar139._4_4_ = auVar138._4_4_ * auVar109._4_4_;
                      auVar139._8_4_ = auVar138._8_4_ * auVar109._8_4_;
                      auVar139._12_4_ = auVar138._12_4_ * auVar109._12_4_;
                      auVar168 = vfmsub231ps_fma(auVar139,auVar210,auVar110);
                      auVar110 = vshufps_avx(auVar168,auVar168,0xc9);
                      auVar109 = vshufps_avx(auVar108,auVar108,0xc9);
                      auVar168 = vshufps_avx(auVar168,auVar168,0xd2);
                      auVar114._0_4_ = auVar108._0_4_ * auVar168._0_4_;
                      auVar114._4_4_ = auVar108._4_4_ * auVar168._4_4_;
                      auVar114._8_4_ = auVar108._8_4_ * auVar168._8_4_;
                      auVar114._12_4_ = auVar108._12_4_ * auVar168._12_4_;
                      auVar110 = vfmsub231ps_fma(auVar114,auVar110,auVar109);
                      uVar100 = auVar110._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar248;
                        uVar4 = vextractps_avx(auVar110,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                        uVar4 = vextractps_avx(auVar110,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar100;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar238;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar3;
                        *(uint *)(ray + k * 4 + 0x240) = uVar95;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar7 = context->user;
                        auVar109 = vmovshdup_avx(auVar110);
                        auVar173._0_8_ = auVar109._0_8_;
                        auVar173._8_8_ = auVar173._0_8_;
                        auVar182._16_8_ = auVar173._0_8_;
                        auVar182._0_16_ = auVar173;
                        auVar182._24_8_ = auVar173._0_8_;
                        auVar110 = vshufps_avx(auVar110,auVar110,0xaa);
                        local_3a0 = auVar110._0_8_;
                        local_3c0[0] = (RTCHitN)(char)auVar173._0_8_;
                        local_3c0[1] = (RTCHitN)SUB81(auVar173._0_8_,1);
                        local_3c0[2] = (RTCHitN)SUB81(auVar173._0_8_,2);
                        local_3c0[3] = (RTCHitN)SUB81(auVar173._0_8_,3);
                        local_3c0[4] = (RTCHitN)SUB81(auVar173._0_8_,4);
                        local_3c0[5] = (RTCHitN)SUB81(auVar173._0_8_,5);
                        local_3c0[6] = (RTCHitN)SUB81(auVar173._0_8_,6);
                        local_3c0[7] = (RTCHitN)SUB81(auVar173._0_8_,7);
                        local_3c0[8] = (RTCHitN)(char)auVar173._0_8_;
                        local_3c0[9] = (RTCHitN)SUB81(auVar173._0_8_,1);
                        local_3c0[10] = (RTCHitN)SUB81(auVar173._0_8_,2);
                        local_3c0[0xb] = (RTCHitN)SUB81(auVar173._0_8_,3);
                        local_3c0[0xc] = (RTCHitN)SUB81(auVar173._0_8_,4);
                        local_3c0[0xd] = (RTCHitN)SUB81(auVar173._0_8_,5);
                        local_3c0[0xe] = (RTCHitN)SUB81(auVar173._0_8_,6);
                        local_3c0[0xf] = (RTCHitN)SUB81(auVar173._0_8_,7);
                        local_3c0[0x10] = (RTCHitN)(char)auVar173._0_8_;
                        local_3c0[0x11] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 8);
                        local_3c0[0x12] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x10);
                        local_3c0[0x13] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x18);
                        local_3c0[0x14] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x20);
                        local_3c0[0x15] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x28);
                        local_3c0[0x16] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x30);
                        local_3c0[0x17] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x38);
                        local_3c0[0x18] = (RTCHitN)(char)auVar173._0_8_;
                        local_3c0[0x19] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 8);
                        local_3c0[0x1a] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x10);
                        local_3c0[0x1b] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x18);
                        local_3c0[0x1c] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x20);
                        local_3c0[0x1d] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x28);
                        local_3c0[0x1e] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x30);
                        local_3c0[0x1f] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x38);
                        uStack_398 = local_3a0;
                        uStack_390 = local_3a0;
                        uStack_388 = local_3a0;
                        local_380 = uVar100;
                        uStack_37c = uVar100;
                        uStack_378 = uVar100;
                        uStack_374 = uVar100;
                        uStack_370 = uVar100;
                        uStack_36c = uVar100;
                        uStack_368 = uVar100;
                        uStack_364 = uVar100;
                        local_360 = fVar238;
                        fStack_35c = fVar238;
                        fStack_358 = fVar238;
                        fStack_354 = fVar238;
                        fStack_350 = fVar238;
                        fStack_34c = fVar238;
                        fStack_348 = fVar238;
                        fStack_344 = fVar238;
                        auVar140._12_4_ = 0;
                        auVar140._0_12_ = ZEXT412(0);
                        auVar140 = auVar140 << 0x20;
                        local_340 = ZEXT1232(ZEXT412(0)) << 0x20;
                        local_320 = CONCAT44(uStack_5fc,local_600);
                        uStack_318 = CONCAT44(uStack_5f4,uStack_5f8);
                        uStack_310 = CONCAT44(uStack_5ec,uStack_5f0);
                        uStack_308 = CONCAT44(uStack_5e4,uStack_5e8);
                        local_300._4_4_ = uStack_5dc;
                        local_300._0_4_ = local_5e0;
                        local_300._8_4_ = uStack_5d8;
                        local_300._12_4_ = uStack_5d4;
                        local_300._16_4_ = uStack_5d0;
                        local_300._20_4_ = uStack_5cc;
                        local_300._24_4_ = uStack_5c8;
                        local_300._28_4_ = uStack_5c4;
                        auVar121 = vpcmpeqd_avx2(local_300,local_300);
                        local_a88[1] = auVar121;
                        *local_a88 = auVar121;
                        local_2e0 = pRVar7->instID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        local_2c0 = pRVar7->instPrimID[0];
                        uStack_2bc = local_2c0;
                        uStack_2b8 = local_2c0;
                        uStack_2b4 = local_2c0;
                        uStack_2b0 = local_2c0;
                        uStack_2ac = local_2c0;
                        uStack_2a8 = local_2c0;
                        uStack_2a4 = local_2c0;
                        *(float *)(ray + k * 4 + 0x100) = fVar248;
                        local_9a0 = local_620._0_8_;
                        uStack_998 = local_620._8_8_;
                        uStack_990 = local_620._16_8_;
                        uStack_988 = local_620._24_8_;
                        local_af0.valid = (int *)&local_9a0;
                        local_af0.geometryUserPtr = pGVar5->userPtr;
                        local_af0.context = context->user;
                        local_af0.hit = local_3c0;
                        local_af0.N = 8;
                        local_af0.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar182 = ZEXT1632(auVar173);
                          auVar246 = ZEXT1664(auVar209);
                          auVar299 = ZEXT1664(auVar134);
                          auVar305 = ZEXT1664(auVar305._0_16_);
                          (*pGVar5->intersectionFilterN)(&local_af0);
                          auVar140 = ZEXT816(0) << 0x40;
                        }
                        auVar121 = ZEXT1632(auVar140);
                        auVar61._8_8_ = uStack_998;
                        auVar61._0_8_ = local_9a0;
                        auVar61._16_8_ = uStack_990;
                        auVar61._24_8_ = uStack_988;
                        auVar126 = vpcmpeqd_avx2(auVar121,auVar61);
                        auVar122 = vpcmpeqd_avx2(auVar121,auVar121);
                        auVar121 = auVar122 & ~auVar126;
                        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar121 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar121 >> 0x7f,0) == '\0')
                              && (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar121 >> 0xbf,0) == '\0') &&
                            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar121[0x1f]) {
                          auVar126 = auVar126 ^ auVar122;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar182 = ZEXT1632(auVar182._0_16_);
                            auVar246 = ZEXT1664(auVar246._0_16_);
                            auVar299 = ZEXT1664(auVar299._0_16_);
                            auVar305 = ZEXT1664(auVar305._0_16_);
                            (*p_Var6)(&local_af0);
                          }
                          auVar62._8_8_ = uStack_998;
                          auVar62._0_8_ = local_9a0;
                          auVar62._16_8_ = uStack_990;
                          auVar62._24_8_ = uStack_988;
                          auVar122 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar62);
                          auVar16 = vpcmpeqd_avx2(auVar182,auVar182);
                          auVar126 = auVar122 ^ auVar16;
                          auVar121 = auVar16 & ~auVar122;
                          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar121 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar121 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar121 >> 0x7f,0) != '\0') ||
                                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar121 >> 0xbf,0) != '\0') ||
                              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar121[0x1f] < '\0') {
                            auVar159._0_4_ = auVar122._0_4_ ^ auVar16._0_4_;
                            auVar159._4_4_ = auVar122._4_4_ ^ auVar16._4_4_;
                            auVar159._8_4_ = auVar122._8_4_ ^ auVar16._8_4_;
                            auVar159._12_4_ = auVar122._12_4_ ^ auVar16._12_4_;
                            auVar159._16_4_ = auVar122._16_4_ ^ auVar16._16_4_;
                            auVar159._20_4_ = auVar122._20_4_ ^ auVar16._20_4_;
                            auVar159._24_4_ = auVar122._24_4_ ^ auVar16._24_4_;
                            auVar159._28_4_ = auVar122._28_4_ ^ auVar16._28_4_;
                            auVar121 = vmaskmovps_avx(auVar159,*(undefined1 (*) [32])local_af0.hit);
                            *(undefined1 (*) [32])(local_af0.ray + 0x180) = auVar121;
                            auVar121 = vmaskmovps_avx(auVar159,*(undefined1 (*) [32])
                                                                (local_af0.hit + 0x20));
                            *(undefined1 (*) [32])(local_af0.ray + 0x1a0) = auVar121;
                            auVar121 = vmaskmovps_avx(auVar159,*(undefined1 (*) [32])
                                                                (local_af0.hit + 0x40));
                            *(undefined1 (*) [32])(local_af0.ray + 0x1c0) = auVar121;
                            auVar121 = vmaskmovps_avx(auVar159,*(undefined1 (*) [32])
                                                                (local_af0.hit + 0x60));
                            *(undefined1 (*) [32])(local_af0.ray + 0x1e0) = auVar121;
                            auVar121 = vmaskmovps_avx(auVar159,*(undefined1 (*) [32])
                                                                (local_af0.hit + 0x80));
                            *(undefined1 (*) [32])(local_af0.ray + 0x200) = auVar121;
                            auVar121 = vpmaskmovd_avx2(auVar159,*(undefined1 (*) [32])
                                                                 (local_af0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_af0.ray + 0x220) = auVar121;
                            auVar121 = vpmaskmovd_avx2(auVar159,*(undefined1 (*) [32])
                                                                 (local_af0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_af0.ray + 0x240) = auVar121;
                            auVar121 = vpmaskmovd_avx2(auVar159,*(undefined1 (*) [32])
                                                                 (local_af0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_af0.ray + 0x260) = auVar121;
                            auVar121 = vpmaskmovd_avx2(auVar159,*(undefined1 (*) [32])
                                                                 (local_af0.hit + 0x100));
                            *(undefined1 (*) [32])(local_af0.ray + 0x280) = auVar121;
                          }
                        }
                        auVar288 = ZEXT464((uint)fVar248);
                        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar126 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar126 >> 0x7f,0) == '\0')
                              && (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar126 >> 0xbf,0) == '\0') &&
                            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar126[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar249;
                        }
                      }
                    }
                  }
                }
                bVar103 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar53) && (bVar103));
              uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar127._4_4_ = uVar100;
              auVar127._0_4_ = uVar100;
              auVar127._8_4_ = uVar100;
              auVar127._12_4_ = uVar100;
              auVar127._16_4_ = uVar100;
              auVar127._20_4_ = uVar100;
              auVar127._24_4_ = uVar100;
              auVar127._28_4_ = uVar100;
              auVar126 = vcmpps_avx(_local_8a0,auVar127,2);
              auVar121 = vandps_avx(auVar126,local_720);
              auVar126 = local_720 & auVar126;
              uVar101 = local_780;
              local_720 = auVar121;
              auVar110 = local_820._16_16_;
            } while ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar126 >> 0x7f,0) != '\0') ||
                       (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar126 >> 0xbf,0) != '\0') ||
                     (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar126[0x1f] < '\0');
          }
          local_820._16_16_ = auVar110;
          auVar267 = ZEXT3264(auVar14);
          auVar52._4_4_ = (float)local_7a0._4_4_ * (float)local_8e0._4_4_;
          auVar52._0_4_ = (float)local_7a0._0_4_ * (float)local_8e0._0_4_;
          auVar52._8_4_ = fStack_798 * fStack_8d8;
          auVar52._12_4_ = fStack_794 * fStack_8d4;
          auVar52._16_4_ = fStack_790 * fStack_8d0;
          auVar52._20_4_ = fStack_78c * fStack_8cc;
          auVar52._24_4_ = fStack_788 * fStack_8c8;
          auVar52._28_4_ = uStack_784;
          auVar110 = vfmadd132ps_fma(local_940,auVar52,_local_8c0);
          auVar110 = vfmadd132ps_fma(local_920,ZEXT1632(auVar110),_local_880);
          auVar71._4_4_ = uStack_8fc;
          auVar71._0_4_ = local_900;
          auVar71._8_4_ = uStack_8f8;
          auVar71._12_4_ = uStack_8f4;
          auVar71._16_4_ = uStack_8f0;
          auVar71._20_4_ = uStack_8ec;
          auVar71._24_4_ = uStack_8e8;
          auVar71._28_4_ = uStack_8e4;
          auVar121 = vandps_avx(ZEXT1632(auVar110),auVar71);
          auVar160._8_4_ = 0x3e99999a;
          auVar160._0_8_ = 0x3e99999a3e99999a;
          auVar160._12_4_ = 0x3e99999a;
          auVar160._16_4_ = 0x3e99999a;
          auVar160._20_4_ = 0x3e99999a;
          auVar160._24_4_ = 0x3e99999a;
          auVar160._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar160,1);
          auVar126 = vorps_avx(auVar121,local_6e0);
          auVar161._0_4_ = auVar14._0_4_ + (float)local_840._0_4_;
          auVar161._4_4_ = auVar14._4_4_ + (float)local_840._4_4_;
          auVar161._8_4_ = auVar14._8_4_ + fStack_838;
          auVar161._12_4_ = auVar14._12_4_ + fStack_834;
          auVar161._16_4_ = auVar14._16_4_ + fStack_830;
          auVar161._20_4_ = auVar14._20_4_ + fStack_82c;
          auVar161._24_4_ = auVar14._24_4_ + fStack_828;
          auVar161._28_4_ = auVar14._28_4_ + fStack_824;
          uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar183._4_4_ = uVar100;
          auVar183._0_4_ = uVar100;
          auVar183._8_4_ = uVar100;
          auVar183._12_4_ = uVar100;
          auVar183._16_4_ = uVar100;
          auVar183._20_4_ = uVar100;
          auVar183._24_4_ = uVar100;
          auVar183._28_4_ = uVar100;
          auVar121 = vcmpps_avx(auVar161,auVar183,2);
          local_920 = vandps_avx(auVar121,local_6c0);
          auVar162._8_4_ = 3;
          auVar162._0_8_ = 0x300000003;
          auVar162._12_4_ = 3;
          auVar162._16_4_ = 3;
          auVar162._20_4_ = 3;
          auVar162._24_4_ = 3;
          auVar162._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar184,auVar162,auVar126);
          local_940 = vpcmpgtd_avx2(auVar121,local_700);
          auVar121 = vpandn_avx2(local_940,local_920);
          auVar126 = local_920 & ~local_940;
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0x7f,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0xbf,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar126[0x1f] < '\0') {
            auVar109 = vminps_avx(auVar11,auVar13);
            auVar110 = vmaxps_avx(auVar11,auVar13);
            auVar168 = vminps_avx(auVar12,auVar10);
            auVar134 = vminps_avx(auVar109,auVar168);
            auVar109 = vmaxps_avx(auVar12,auVar10);
            auVar168 = vmaxps_avx(auVar110,auVar109);
            auVar110 = vandps_avx(auVar134,local_a00);
            auVar109 = vandps_avx(auVar168,local_a00);
            auVar110 = vmaxps_avx(auVar110,auVar109);
            auVar109 = vmovshdup_avx(auVar110);
            auVar109 = vmaxss_avx(auVar109,auVar110);
            auVar110 = vshufpd_avx(auVar110,auVar110,1);
            auVar110 = vmaxss_avx(auVar110,auVar109);
            local_a40._0_4_ = auVar110._0_4_ * 1.9073486e-06;
            local_820._0_16_ = vshufps_avx(auVar168,auVar168,0xff);
            local_860 = _local_2a0;
            local_8a0._4_4_ = (float)local_2a0._4_4_ + (float)local_840._4_4_;
            local_8a0._0_4_ = (float)local_2a0._0_4_ + (float)local_840._0_4_;
            fStack_898 = fStack_298 + fStack_838;
            fStack_894 = fStack_294 + fStack_834;
            fStack_890 = fStack_290 + fStack_830;
            fStack_88c = fStack_28c + fStack_82c;
            fStack_888 = fStack_288 + fStack_828;
            fStack_884 = fStack_284 + fStack_824;
            do {
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar126 = vblendvps_avx(auVar163,local_860,auVar121);
              auVar122 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar122 = vminps_avx(auVar126,auVar122);
              auVar14 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar14);
              auVar14 = vpermpd_avx2(auVar122,0x4e);
              auVar122 = vminps_avx(auVar122,auVar14);
              auVar122 = vcmpps_avx(auVar126,auVar122,0);
              auVar14 = auVar121 & auVar122;
              auVar126 = auVar121;
              if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar14 >> 0x7f,0) != '\0') ||
                    (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0xbf,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar14[0x1f] < '\0') {
                auVar126 = vandps_avx(auVar122,auVar121);
              }
              uVar97 = vmovmskps_avx(auVar126);
              iVar96 = 0;
              for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
                iVar96 = iVar96 + 1;
              }
              uVar97 = iVar96 << 2;
              local_740 = auVar121;
              *(undefined4 *)(local_740 + uVar97) = 0;
              fVar238 = *(float *)(local_680 + uVar97);
              uVar97 = *(uint *)(local_280 + uVar97);
              fVar248 = auVar9._0_4_;
              if ((float)local_a10._0_4_ < 0.0) {
                fVar248 = sqrtf((float)local_a10._0_4_);
              }
              auVar288 = ZEXT464(uVar97);
              local_a60._0_4_ = fVar248 * 1.9073486e-06;
              lVar102 = 4;
              do {
                fVar248 = auVar288._0_4_;
                auVar115._4_4_ = fVar248;
                auVar115._0_4_ = fVar248;
                auVar115._8_4_ = fVar248;
                auVar115._12_4_ = fVar248;
                auVar109 = vfmadd213ps_fma(auVar115,local_9f0,_DAT_01feba10);
                fVar251 = 1.0 - fVar238;
                auVar116 = SUB6416(ZEXT464(0x40400000),0);
                auVar108 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar144 = ZEXT416((uint)fVar238);
                auVar168 = vfmadd213ss_fma(auVar116,auVar144,auVar108);
                auVar110 = vfmadd213ss_fma(auVar168,ZEXT416((uint)(fVar238 * fVar238)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar134 = vfmadd213ss_fma(auVar116,ZEXT416((uint)fVar251),auVar108);
                auVar134 = vfmadd213ss_fma(auVar134,ZEXT416((uint)(fVar251 * fVar251)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar105 = fVar251 * fVar251 * -fVar238 * 0.5;
                fVar249 = auVar110._0_4_ * 0.5;
                fVar250 = auVar134._0_4_ * 0.5;
                fVar106 = fVar238 * fVar238 * -fVar251 * 0.5;
                auVar195._0_4_ = fVar106 * fVar132;
                auVar195._4_4_ = fVar106 * fStack_b2c;
                auVar195._8_4_ = fVar106 * fStack_b28;
                auVar195._12_4_ = fVar106 * fStack_b24;
                auVar213._4_4_ = fVar250;
                auVar213._0_4_ = fVar250;
                auVar213._8_4_ = fVar250;
                auVar213._12_4_ = fVar250;
                auVar110 = vfmadd132ps_fma(auVar213,auVar195,auVar12);
                auVar174._4_4_ = fVar249;
                auVar174._0_4_ = fVar249;
                auVar174._8_4_ = fVar249;
                auVar174._12_4_ = fVar249;
                auVar110 = vfmadd132ps_fma(auVar174,auVar110,auVar13);
                auVar196._4_4_ = fVar105;
                auVar196._0_4_ = fVar105;
                auVar196._8_4_ = fVar105;
                auVar196._12_4_ = fVar105;
                auVar110 = vfmadd132ps_fma(auVar196,auVar110,auVar11);
                auVar108 = vfmadd231ss_fma(auVar108,auVar144,ZEXT416(0x41100000));
                auVar134 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar144,
                                           ZEXT416(0x40800000));
                local_ac0._0_16_ = auVar134;
                local_7e0._0_16_ = auVar110;
                auVar109 = vsubps_avx(auVar109,auVar110);
                auVar110 = vdpps_avx(auVar109,auVar109,0x7f);
                auVar134 = vfmadd213ss_fma(auVar116,auVar144,ZEXT416(0xbf800000));
                fVar105 = auVar110._0_4_;
                if (fVar105 < 0.0) {
                  local_a80._0_4_ = auVar168._0_4_;
                  auVar207._0_4_ = sqrtf(fVar105);
                  auVar207._4_60_ = extraout_var_00;
                  auVar168 = ZEXT416((uint)local_a80._0_4_);
                  auVar116 = auVar207._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar110,auVar110);
                }
                auVar168 = vfmadd213ss_fma(auVar168,ZEXT416((uint)(fVar238 + fVar238)),
                                           ZEXT416((uint)(fVar238 * fVar238 * 3.0)));
                auVar209 = SUB6416(ZEXT464(0x40000000),0);
                auVar210 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar144,auVar209);
                auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar251 * -3.0)),
                                           ZEXT416((uint)(fVar251 + fVar251)),auVar210);
                auVar133 = vfnmadd231ss_fma(ZEXT416((uint)(fVar238 * (fVar251 + fVar251))),
                                            ZEXT416((uint)fVar251),ZEXT416((uint)fVar251));
                auVar210 = vfmadd213ss_fma(ZEXT416((uint)(fVar251 * -2.0)),auVar144,
                                           ZEXT416((uint)(fVar238 * fVar238)));
                fVar249 = auVar133._0_4_ * 0.5;
                fVar250 = auVar168._0_4_ * 0.5;
                fVar106 = auVar107._0_4_ * 0.5;
                fVar251 = auVar210._0_4_ * 0.5;
                auVar197._0_4_ = fVar132 * fVar251;
                auVar197._4_4_ = fStack_b2c * fVar251;
                auVar197._8_4_ = fStack_b28 * fVar251;
                auVar197._12_4_ = fStack_b24 * fVar251;
                auVar175._4_4_ = fVar106;
                auVar175._0_4_ = fVar106;
                auVar175._8_4_ = fVar106;
                auVar175._12_4_ = fVar106;
                auVar168 = vfmadd213ps_fma(auVar175,auVar12,auVar197);
                auVar141._4_4_ = fVar250;
                auVar141._0_4_ = fVar250;
                auVar141._8_4_ = fVar250;
                auVar141._12_4_ = fVar250;
                auVar168 = vfmadd213ps_fma(auVar141,auVar13,auVar168);
                auVar293._4_4_ = fVar249;
                auVar293._0_4_ = fVar249;
                auVar293._8_4_ = fVar249;
                auVar293._12_4_ = fVar249;
                auVar210 = vfmadd213ps_fma(auVar293,auVar11,auVar168);
                auVar144 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar144,auVar209);
                local_ba0 = auVar134._0_4_;
                auVar117._0_4_ = fVar132 * local_ba0;
                auVar117._4_4_ = fStack_b2c * local_ba0;
                auVar117._8_4_ = fStack_b28 * local_ba0;
                auVar117._12_4_ = fStack_b24 * local_ba0;
                auVar176._4_4_ = local_ac0._0_4_;
                auVar176._0_4_ = local_ac0._0_4_;
                auVar176._8_4_ = local_ac0._0_4_;
                auVar176._12_4_ = local_ac0._0_4_;
                auVar168 = vfmadd213ps_fma(auVar176,auVar12,auVar117);
                uVar100 = auVar108._0_4_;
                auVar198._4_4_ = uVar100;
                auVar198._0_4_ = uVar100;
                auVar198._8_4_ = uVar100;
                auVar198._12_4_ = uVar100;
                auVar168 = vfmadd213ps_fma(auVar198,auVar13,auVar168);
                auVar134 = vdpps_avx(auVar210,auVar210,0x7f);
                auVar142._0_4_ = auVar144._0_4_;
                auVar142._4_4_ = auVar142._0_4_;
                auVar142._8_4_ = auVar142._0_4_;
                auVar142._12_4_ = auVar142._0_4_;
                auVar144 = vfmadd213ps_fma(auVar142,auVar11,auVar168);
                auVar168 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar108 = vrsqrtss_avx(auVar168,auVar168);
                fVar106 = auVar134._0_4_;
                fVar249 = auVar108._0_4_;
                auVar108 = vdpps_avx(auVar210,auVar144,0x7f);
                fVar249 = fVar249 * 1.5 + fVar106 * -0.5 * fVar249 * fVar249 * fVar249;
                auVar143._0_4_ = auVar144._0_4_ * fVar106;
                auVar143._4_4_ = auVar144._4_4_ * fVar106;
                auVar143._8_4_ = auVar144._8_4_ * fVar106;
                auVar143._12_4_ = auVar144._12_4_ * fVar106;
                fVar250 = auVar108._0_4_;
                auVar227._0_4_ = auVar210._0_4_ * fVar250;
                auVar227._4_4_ = auVar210._4_4_ * fVar250;
                fVar251 = auVar210._8_4_;
                auVar227._8_4_ = fVar251 * fVar250;
                fVar252 = auVar210._12_4_;
                auVar227._12_4_ = fVar252 * fVar250;
                auVar108 = vsubps_avx(auVar143,auVar227);
                auVar168 = vrcpss_avx(auVar168,auVar168);
                auVar144 = vfnmadd213ss_fma(auVar168,auVar134,auVar209);
                fVar250 = auVar168._0_4_ * auVar144._0_4_;
                auVar168 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                      ZEXT416((uint)(fVar248 * (float)local_a60._0_4_)));
                auVar267 = ZEXT1664(auVar168);
                auVar241._0_8_ = auVar210._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = -fVar251;
                auVar241._12_4_ = -fVar252;
                auVar199._0_4_ = fVar249 * auVar108._0_4_ * fVar250;
                auVar199._4_4_ = fVar249 * auVar108._4_4_ * fVar250;
                auVar199._8_4_ = fVar249 * auVar108._8_4_ * fVar250;
                auVar199._12_4_ = fVar249 * auVar108._12_4_ * fVar250;
                auVar280._0_4_ = auVar210._0_4_ * fVar249;
                auVar280._4_4_ = auVar210._4_4_ * fVar249;
                auVar280._8_4_ = fVar251 * fVar249;
                auVar280._12_4_ = fVar252 * fVar249;
                local_ac0._0_4_ = auVar168._0_4_;
                if (fVar106 < -fVar106) {
                  local_a80._0_16_ = auVar241;
                  fVar249 = sqrtf(fVar106);
                  auVar267 = ZEXT464((uint)local_ac0._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                  auVar241 = local_a80._0_16_;
                }
                else {
                  auVar168 = vsqrtss_avx(auVar134,auVar134);
                  fVar249 = auVar168._0_4_;
                }
                auVar168 = vdpps_avx(auVar109,auVar280,0x7f);
                auVar107 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar116,auVar267._0_16_);
                auVar134 = vdpps_avx(auVar241,auVar280,0x7f);
                auVar108 = vdpps_avx(auVar109,auVar199,0x7f);
                auVar144 = vdpps_avx(local_9f0,auVar280,0x7f);
                auVar107 = vfmadd213ss_fma(ZEXT416((uint)(auVar116._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a40._0_4_ / fVar249)),
                                           auVar107);
                auVar299 = ZEXT1664(auVar107);
                fVar249 = auVar134._0_4_ + auVar108._0_4_;
                auVar305 = ZEXT464((uint)fVar249);
                auVar118._0_4_ = auVar168._0_4_ * auVar168._0_4_;
                auVar118._4_4_ = auVar168._4_4_ * auVar168._4_4_;
                auVar118._8_4_ = auVar168._8_4_ * auVar168._8_4_;
                auVar118._12_4_ = auVar168._12_4_ * auVar168._12_4_;
                auVar134 = vdpps_avx(auVar109,auVar241,0x7f);
                auVar116 = vsubps_avx(auVar110,auVar118);
                auVar108 = vrsqrtss_avx(auVar116,auVar116);
                fVar106 = auVar116._0_4_;
                fVar250 = auVar108._0_4_;
                fVar250 = fVar250 * 1.5 + fVar106 * -0.5 * fVar250 * fVar250 * fVar250;
                auVar108 = vdpps_avx(auVar109,local_9f0,0x7f);
                auVar134 = vfnmadd231ss_fma(auVar134,auVar168,ZEXT416((uint)fVar249));
                auVar108 = vfnmadd231ss_fma(auVar108,auVar168,auVar144);
                if (fVar106 < 0.0) {
                  local_a80._0_4_ = auVar107._0_4_;
                  local_9c0._0_4_ = fVar250;
                  local_800._0_16_ = auVar108;
                  fVar106 = sqrtf(fVar106);
                  auVar305 = ZEXT1664(ZEXT416((uint)fVar249));
                  auVar299 = ZEXT464((uint)local_a80._0_4_);
                  auVar267 = ZEXT464((uint)local_ac0._0_4_);
                  fVar250 = (float)local_9c0._0_4_;
                  auVar108 = local_800._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar116,auVar116);
                  fVar106 = auVar116._0_4_;
                }
                auVar246 = ZEXT1664(auVar210);
                auVar107 = vpermilps_avx(local_7e0._0_16_,0xff);
                auVar116 = vshufps_avx(auVar210,auVar210,0xff);
                auVar134 = vfmsub213ss_fma(auVar134,ZEXT416((uint)fVar250),auVar116);
                auVar200._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
                auVar200._8_4_ = auVar144._8_4_ ^ 0x80000000;
                auVar200._12_4_ = auVar144._12_4_ ^ 0x80000000;
                auVar214._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
                auVar214._8_4_ = auVar134._8_4_ ^ 0x80000000;
                auVar214._12_4_ = auVar134._12_4_ ^ 0x80000000;
                auVar133 = ZEXT416((uint)(auVar108._0_4_ * fVar250));
                auVar209 = auVar305._0_16_;
                auVar108 = vfmsub231ss_fma(ZEXT416((uint)(auVar144._0_4_ * auVar134._0_4_)),auVar209
                                           ,auVar133);
                auVar134 = vinsertps_avx(auVar133,auVar200,0x10);
                uVar100 = auVar108._0_4_;
                auVar201._4_4_ = uVar100;
                auVar201._0_4_ = uVar100;
                auVar201._8_4_ = uVar100;
                auVar201._12_4_ = uVar100;
                auVar134 = vdivps_avx(auVar134,auVar201);
                auVar144 = ZEXT416((uint)(fVar106 - auVar107._0_4_));
                auVar108 = vinsertps_avx(auVar168,auVar144,0x10);
                auVar177._0_4_ = auVar108._0_4_ * auVar134._0_4_;
                auVar177._4_4_ = auVar108._4_4_ * auVar134._4_4_;
                auVar177._8_4_ = auVar108._8_4_ * auVar134._8_4_;
                auVar177._12_4_ = auVar108._12_4_ * auVar134._12_4_;
                auVar134 = vinsertps_avx(auVar214,auVar209,0x1c);
                auVar134 = vdivps_avx(auVar134,auVar201);
                auVar202._0_4_ = auVar108._0_4_ * auVar134._0_4_;
                auVar202._4_4_ = auVar108._4_4_ * auVar134._4_4_;
                auVar202._8_4_ = auVar108._8_4_ * auVar134._8_4_;
                auVar202._12_4_ = auVar108._12_4_ * auVar134._12_4_;
                auVar134 = vhaddps_avx(auVar177,auVar177);
                auVar108 = vhaddps_avx(auVar202,auVar202);
                fVar238 = fVar238 - auVar134._0_4_;
                fVar248 = fVar248 - auVar108._0_4_;
                auVar288 = ZEXT464((uint)fVar248);
                auVar168 = vandps_avx(auVar168,local_a00);
                if (auVar299._0_4_ <= auVar168._0_4_) {
LAB_016bf935:
                  bVar53 = false;
                }
                else {
                  auVar134 = vfmadd231ss_fma(ZEXT416((uint)(auVar267._0_4_ + auVar299._0_4_)),
                                             local_820._0_16_,ZEXT416(0x36000000));
                  auVar168 = vandps_avx(auVar144,local_a00);
                  if (auVar134._0_4_ <= auVar168._0_4_) goto LAB_016bf935;
                  fVar248 = fVar248 + (float)local_960._0_4_;
                  auVar288 = ZEXT464((uint)fVar248);
                  bVar53 = true;
                  if ((((fVar104 <= fVar248) &&
                       (fVar249 = *(float *)(ray + k * 4 + 0x100), fVar248 <= fVar249)) &&
                      (0.0 <= fVar238)) && (fVar238 <= 1.0)) {
                    auVar110 = vrsqrtss_avx(auVar110,auVar110);
                    fVar250 = auVar110._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar95].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar105 = fVar250 * 1.5 + fVar105 * -0.5 * fVar250 * fVar250 * fVar250;
                      local_b60 = auVar109._0_4_;
                      fStack_b5c = auVar109._4_4_;
                      fStack_b58 = auVar109._8_4_;
                      fStack_b54 = auVar109._12_4_;
                      auVar145._0_4_ = fVar105 * local_b60;
                      auVar145._4_4_ = fVar105 * fStack_b5c;
                      auVar145._8_4_ = fVar105 * fStack_b58;
                      auVar145._12_4_ = fVar105 * fStack_b54;
                      auVar134 = vfmadd213ps_fma(auVar116,auVar145,auVar210);
                      auVar110 = vshufps_avx(auVar145,auVar145,0xc9);
                      auVar109 = vshufps_avx(auVar210,auVar210,0xc9);
                      auVar146._0_4_ = auVar145._0_4_ * auVar109._0_4_;
                      auVar146._4_4_ = auVar145._4_4_ * auVar109._4_4_;
                      auVar146._8_4_ = auVar145._8_4_ * auVar109._8_4_;
                      auVar146._12_4_ = auVar145._12_4_ * auVar109._12_4_;
                      auVar168 = vfmsub231ps_fma(auVar146,auVar210,auVar110);
                      auVar110 = vshufps_avx(auVar168,auVar168,0xc9);
                      auVar109 = vshufps_avx(auVar134,auVar134,0xc9);
                      auVar168 = vshufps_avx(auVar168,auVar168,0xd2);
                      auVar119._0_4_ = auVar134._0_4_ * auVar168._0_4_;
                      auVar119._4_4_ = auVar134._4_4_ * auVar168._4_4_;
                      auVar119._8_4_ = auVar134._8_4_ * auVar168._8_4_;
                      auVar119._12_4_ = auVar134._12_4_ * auVar168._12_4_;
                      auVar110 = vfmsub231ps_fma(auVar119,auVar110,auVar109);
                      uVar100 = auVar110._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar248;
                        uVar4 = vextractps_avx(auVar110,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                        uVar4 = vextractps_avx(auVar110,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar100;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar238;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar3;
                        *(uint *)(ray + k * 4 + 0x240) = uVar95;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar7 = context->user;
                        auVar109 = vmovshdup_avx(auVar110);
                        auVar178._0_8_ = auVar109._0_8_;
                        auVar178._8_8_ = auVar178._0_8_;
                        auVar185._16_8_ = auVar178._0_8_;
                        auVar185._0_16_ = auVar178;
                        auVar185._24_8_ = auVar178._0_8_;
                        auVar110 = vshufps_avx(auVar110,auVar110,0xaa);
                        local_3a0 = auVar110._0_8_;
                        local_3c0[0] = (RTCHitN)(char)auVar178._0_8_;
                        local_3c0[1] = (RTCHitN)SUB81(auVar178._0_8_,1);
                        local_3c0[2] = (RTCHitN)SUB81(auVar178._0_8_,2);
                        local_3c0[3] = (RTCHitN)SUB81(auVar178._0_8_,3);
                        local_3c0[4] = (RTCHitN)SUB81(auVar178._0_8_,4);
                        local_3c0[5] = (RTCHitN)SUB81(auVar178._0_8_,5);
                        local_3c0[6] = (RTCHitN)SUB81(auVar178._0_8_,6);
                        local_3c0[7] = (RTCHitN)SUB81(auVar178._0_8_,7);
                        local_3c0[8] = (RTCHitN)(char)auVar178._0_8_;
                        local_3c0[9] = (RTCHitN)SUB81(auVar178._0_8_,1);
                        local_3c0[10] = (RTCHitN)SUB81(auVar178._0_8_,2);
                        local_3c0[0xb] = (RTCHitN)SUB81(auVar178._0_8_,3);
                        local_3c0[0xc] = (RTCHitN)SUB81(auVar178._0_8_,4);
                        local_3c0[0xd] = (RTCHitN)SUB81(auVar178._0_8_,5);
                        local_3c0[0xe] = (RTCHitN)SUB81(auVar178._0_8_,6);
                        local_3c0[0xf] = (RTCHitN)SUB81(auVar178._0_8_,7);
                        local_3c0[0x10] = (RTCHitN)(char)auVar178._0_8_;
                        local_3c0[0x11] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 8);
                        local_3c0[0x12] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x10);
                        local_3c0[0x13] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x18);
                        local_3c0[0x14] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x20);
                        local_3c0[0x15] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x28);
                        local_3c0[0x16] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x30);
                        local_3c0[0x17] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x38);
                        local_3c0[0x18] = (RTCHitN)(char)auVar178._0_8_;
                        local_3c0[0x19] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 8);
                        local_3c0[0x1a] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x10);
                        local_3c0[0x1b] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x18);
                        local_3c0[0x1c] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x20);
                        local_3c0[0x1d] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x28);
                        local_3c0[0x1e] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x30);
                        local_3c0[0x1f] = (RTCHitN)(char)((ulong)auVar178._0_8_ >> 0x38);
                        uStack_398 = local_3a0;
                        uStack_390 = local_3a0;
                        uStack_388 = local_3a0;
                        local_380 = uVar100;
                        uStack_37c = uVar100;
                        uStack_378 = uVar100;
                        uStack_374 = uVar100;
                        uStack_370 = uVar100;
                        uStack_36c = uVar100;
                        uStack_368 = uVar100;
                        uStack_364 = uVar100;
                        local_360 = fVar238;
                        fStack_35c = fVar238;
                        fStack_358 = fVar238;
                        fStack_354 = fVar238;
                        fStack_350 = fVar238;
                        fStack_34c = fVar238;
                        fStack_348 = fVar238;
                        fStack_344 = fVar238;
                        auVar147._12_4_ = 0;
                        auVar147._0_12_ = ZEXT412(0);
                        auVar147 = auVar147 << 0x20;
                        local_340 = ZEXT1232(ZEXT412(0)) << 0x20;
                        local_320 = CONCAT44(uStack_5fc,local_600);
                        uStack_318 = CONCAT44(uStack_5f4,uStack_5f8);
                        uStack_310 = CONCAT44(uStack_5ec,uStack_5f0);
                        uStack_308 = CONCAT44(uStack_5e4,uStack_5e8);
                        local_300._4_4_ = uStack_5dc;
                        local_300._0_4_ = local_5e0;
                        local_300._8_4_ = uStack_5d8;
                        local_300._12_4_ = uStack_5d4;
                        local_300._16_4_ = uStack_5d0;
                        local_300._20_4_ = uStack_5cc;
                        local_300._24_4_ = uStack_5c8;
                        local_300._28_4_ = uStack_5c4;
                        auVar121 = vpcmpeqd_avx2(local_300,local_300);
                        local_a88[1] = auVar121;
                        *local_a88 = auVar121;
                        local_2e0 = pRVar7->instID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        local_2c0 = pRVar7->instPrimID[0];
                        uStack_2bc = local_2c0;
                        uStack_2b8 = local_2c0;
                        uStack_2b4 = local_2c0;
                        uStack_2b0 = local_2c0;
                        uStack_2ac = local_2c0;
                        uStack_2a8 = local_2c0;
                        uStack_2a4 = local_2c0;
                        *(float *)(ray + k * 4 + 0x100) = fVar248;
                        local_9a0 = local_620._0_8_;
                        uStack_998 = local_620._8_8_;
                        uStack_990 = local_620._16_8_;
                        uStack_988 = local_620._24_8_;
                        local_af0.valid = (int *)&local_9a0;
                        local_af0.geometryUserPtr = pGVar5->userPtr;
                        local_af0.context = context->user;
                        local_af0.hit = local_3c0;
                        local_af0.N = 8;
                        local_af0.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar185 = ZEXT1632(auVar178);
                          auVar246 = ZEXT1664(auVar210);
                          auVar267 = ZEXT1664(auVar267._0_16_);
                          auVar299 = ZEXT1664(auVar299._0_16_);
                          auVar305 = ZEXT1664(auVar209);
                          (*pGVar5->intersectionFilterN)(&local_af0);
                          auVar147 = ZEXT816(0) << 0x40;
                        }
                        auVar121 = ZEXT1632(auVar147);
                        auVar63._8_8_ = uStack_998;
                        auVar63._0_8_ = local_9a0;
                        auVar63._16_8_ = uStack_990;
                        auVar63._24_8_ = uStack_988;
                        auVar126 = vpcmpeqd_avx2(auVar121,auVar63);
                        auVar122 = vpcmpeqd_avx2(auVar121,auVar121);
                        auVar121 = auVar122 & ~auVar126;
                        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar121 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar121 >> 0x7f,0) == '\0')
                              && (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar121 >> 0xbf,0) == '\0') &&
                            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar121[0x1f]) {
                          auVar126 = auVar126 ^ auVar122;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar185 = ZEXT1632(auVar185._0_16_);
                            auVar246 = ZEXT1664(auVar246._0_16_);
                            auVar267 = ZEXT1664(auVar267._0_16_);
                            auVar299 = ZEXT1664(auVar299._0_16_);
                            auVar305 = ZEXT1664(auVar305._0_16_);
                            (*p_Var6)(&local_af0);
                          }
                          auVar64._8_8_ = uStack_998;
                          auVar64._0_8_ = local_9a0;
                          auVar64._16_8_ = uStack_990;
                          auVar64._24_8_ = uStack_988;
                          auVar122 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar64);
                          auVar14 = vpcmpeqd_avx2(auVar185,auVar185);
                          auVar126 = auVar122 ^ auVar14;
                          auVar121 = auVar14 & ~auVar122;
                          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar121 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar121 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar121 >> 0x7f,0) != '\0') ||
                                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar121 >> 0xbf,0) != '\0') ||
                              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar121[0x1f] < '\0') {
                            auVar164._0_4_ = auVar122._0_4_ ^ auVar14._0_4_;
                            auVar164._4_4_ = auVar122._4_4_ ^ auVar14._4_4_;
                            auVar164._8_4_ = auVar122._8_4_ ^ auVar14._8_4_;
                            auVar164._12_4_ = auVar122._12_4_ ^ auVar14._12_4_;
                            auVar164._16_4_ = auVar122._16_4_ ^ auVar14._16_4_;
                            auVar164._20_4_ = auVar122._20_4_ ^ auVar14._20_4_;
                            auVar164._24_4_ = auVar122._24_4_ ^ auVar14._24_4_;
                            auVar164._28_4_ = auVar122._28_4_ ^ auVar14._28_4_;
                            auVar121 = vmaskmovps_avx(auVar164,*(undefined1 (*) [32])local_af0.hit);
                            *(undefined1 (*) [32])(local_af0.ray + 0x180) = auVar121;
                            auVar121 = vmaskmovps_avx(auVar164,*(undefined1 (*) [32])
                                                                (local_af0.hit + 0x20));
                            *(undefined1 (*) [32])(local_af0.ray + 0x1a0) = auVar121;
                            auVar121 = vmaskmovps_avx(auVar164,*(undefined1 (*) [32])
                                                                (local_af0.hit + 0x40));
                            *(undefined1 (*) [32])(local_af0.ray + 0x1c0) = auVar121;
                            auVar121 = vmaskmovps_avx(auVar164,*(undefined1 (*) [32])
                                                                (local_af0.hit + 0x60));
                            *(undefined1 (*) [32])(local_af0.ray + 0x1e0) = auVar121;
                            auVar121 = vmaskmovps_avx(auVar164,*(undefined1 (*) [32])
                                                                (local_af0.hit + 0x80));
                            *(undefined1 (*) [32])(local_af0.ray + 0x200) = auVar121;
                            auVar121 = vpmaskmovd_avx2(auVar164,*(undefined1 (*) [32])
                                                                 (local_af0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_af0.ray + 0x220) = auVar121;
                            auVar121 = vpmaskmovd_avx2(auVar164,*(undefined1 (*) [32])
                                                                 (local_af0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_af0.ray + 0x240) = auVar121;
                            auVar121 = vpmaskmovd_avx2(auVar164,*(undefined1 (*) [32])
                                                                 (local_af0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_af0.ray + 0x260) = auVar121;
                            auVar121 = vpmaskmovd_avx2(auVar164,*(undefined1 (*) [32])
                                                                 (local_af0.hit + 0x100));
                            *(undefined1 (*) [32])(local_af0.ray + 0x280) = auVar121;
                          }
                        }
                        auVar288 = ZEXT464((uint)fVar248);
                        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar126 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar126 >> 0x7f,0) == '\0')
                              && (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar126 >> 0xbf,0) == '\0') &&
                            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar126[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar249;
                        }
                      }
                    }
                  }
                }
                bVar103 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar53) && (bVar103));
              uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar128._4_4_ = uVar100;
              auVar128._0_4_ = uVar100;
              auVar128._8_4_ = uVar100;
              auVar128._12_4_ = uVar100;
              auVar128._16_4_ = uVar100;
              auVar128._20_4_ = uVar100;
              auVar128._24_4_ = uVar100;
              auVar128._28_4_ = uVar100;
              auVar126 = vcmpps_avx(_local_8a0,auVar128,2);
              auVar121 = vandps_avx(auVar126,local_740);
              local_740 = local_740 & auVar126;
              uVar101 = local_780;
            } while ((((((((local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_740 >> 0x7f,0) != '\0') ||
                       (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_740 >> 0xbf,0) != '\0') ||
                     (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_740[0x1f] < '\0');
          }
          auVar165._0_4_ = (float)local_840._0_4_ + local_400._0_4_;
          auVar165._4_4_ = (float)local_840._4_4_ + local_400._4_4_;
          auVar165._8_4_ = fStack_838 + local_400._8_4_;
          auVar165._12_4_ = fStack_834 + local_400._12_4_;
          auVar165._16_4_ = fStack_830 + local_400._16_4_;
          auVar165._20_4_ = fStack_82c + local_400._20_4_;
          auVar165._24_4_ = fStack_828 + local_400._24_4_;
          auVar165._28_4_ = fStack_824 + local_400._28_4_;
          uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar205._4_4_ = uVar100;
          auVar205._0_4_ = uVar100;
          auVar205._8_4_ = uVar100;
          auVar205._12_4_ = uVar100;
          auVar205._16_4_ = uVar100;
          auVar205._20_4_ = uVar100;
          auVar205._24_4_ = uVar100;
          auVar205._28_4_ = uVar100;
          auVar126 = vcmpps_avx(auVar165,auVar205,2);
          auVar121 = vandps_avx(local_7c0,local_6a0);
          auVar121 = vandps_avx(auVar126,auVar121);
          auVar216._0_4_ = (float)local_840._0_4_ + local_2a0._0_4_;
          auVar216._4_4_ = (float)local_840._4_4_ + local_2a0._4_4_;
          auVar216._8_4_ = fStack_838 + local_2a0._8_4_;
          auVar216._12_4_ = fStack_834 + local_2a0._12_4_;
          auVar216._16_4_ = fStack_830 + local_2a0._16_4_;
          auVar216._20_4_ = fStack_82c + local_2a0._20_4_;
          auVar216._24_4_ = fStack_828 + local_2a0._24_4_;
          auVar216._28_4_ = fStack_824 + local_2a0._28_4_;
          auVar122 = vcmpps_avx(auVar216,auVar205,2);
          auVar126 = vandps_avx(local_940,local_920);
          auVar126 = vandps_avx(auVar122,auVar126);
          auVar126 = vorps_avx(auVar121,auVar126);
          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar126 >> 0x7f,0) != '\0') ||
                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0xbf,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar126[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar98 * 0x60) = auVar126;
            auVar121 = vblendvps_avx(_local_2a0,local_400,auVar121);
            *(undefined1 (*) [32])(auStack_160 + uVar98 * 0x60) = auVar121;
            auVar66._8_8_ = uStack_968;
            auVar66._0_8_ = local_970;
            uVar1 = vmovlps_avx(auVar66);
            *(undefined8 *)(afStack_140 + uVar98 * 0x18) = uVar1;
            auStack_138[uVar98 * 0x18] = (int)uVar101 + 1;
            uVar98 = (ulong)((int)uVar98 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar98 == 0) {
        uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar120._4_4_ = uVar100;
        auVar120._0_4_ = uVar100;
        auVar120._8_4_ = uVar100;
        auVar120._12_4_ = uVar100;
        auVar8 = vcmpps_avx(local_630,auVar120,2);
        uVar95 = vmovmskps_avx(auVar8);
        uVar95 = (uint)local_948 & uVar95;
        if (uVar95 == 0) {
          return;
        }
        goto LAB_016bd39b;
      }
      uVar99 = (ulong)((int)uVar98 - 1);
      lVar102 = uVar99 * 0x60;
      auVar121 = *(undefined1 (*) [32])(auStack_160 + lVar102);
      auVar129._0_4_ = auVar121._0_4_ + (float)local_840._0_4_;
      auVar129._4_4_ = auVar121._4_4_ + (float)local_840._4_4_;
      auVar129._8_4_ = auVar121._8_4_ + fStack_838;
      auVar129._12_4_ = auVar121._12_4_ + fStack_834;
      auVar129._16_4_ = auVar121._16_4_ + fStack_830;
      auVar129._20_4_ = auVar121._20_4_ + fStack_82c;
      auVar129._24_4_ = auVar121._24_4_ + fStack_828;
      auVar129._28_4_ = auVar121._28_4_ + fStack_824;
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar206._4_4_ = uVar100;
      auVar206._0_4_ = uVar100;
      auVar206._8_4_ = uVar100;
      auVar206._12_4_ = uVar100;
      auVar206._16_4_ = uVar100;
      auVar206._20_4_ = uVar100;
      auVar206._24_4_ = uVar100;
      auVar206._28_4_ = uVar100;
      auVar122 = vcmpps_avx(auVar129,auVar206,2);
      auVar126 = vandps_avx(auVar122,*(undefined1 (*) [32])(auStack_180 + lVar102));
      local_3c0[0] = (RTCHitN)auVar126[0];
      local_3c0[1] = (RTCHitN)auVar126[1];
      local_3c0[2] = (RTCHitN)auVar126[2];
      local_3c0[3] = (RTCHitN)auVar126[3];
      local_3c0[4] = (RTCHitN)auVar126[4];
      local_3c0[5] = (RTCHitN)auVar126[5];
      local_3c0[6] = (RTCHitN)auVar126[6];
      local_3c0[7] = (RTCHitN)auVar126[7];
      local_3c0[8] = (RTCHitN)auVar126[8];
      local_3c0[9] = (RTCHitN)auVar126[9];
      local_3c0[10] = (RTCHitN)auVar126[10];
      local_3c0[0xb] = (RTCHitN)auVar126[0xb];
      local_3c0[0xc] = (RTCHitN)auVar126[0xc];
      local_3c0[0xd] = (RTCHitN)auVar126[0xd];
      local_3c0[0xe] = (RTCHitN)auVar126[0xe];
      local_3c0[0xf] = (RTCHitN)auVar126[0xf];
      local_3c0[0x10] = (RTCHitN)auVar126[0x10];
      local_3c0[0x11] = (RTCHitN)auVar126[0x11];
      local_3c0[0x12] = (RTCHitN)auVar126[0x12];
      local_3c0[0x13] = (RTCHitN)auVar126[0x13];
      local_3c0[0x14] = (RTCHitN)auVar126[0x14];
      local_3c0[0x15] = (RTCHitN)auVar126[0x15];
      local_3c0[0x16] = (RTCHitN)auVar126[0x16];
      local_3c0[0x17] = (RTCHitN)auVar126[0x17];
      local_3c0[0x18] = (RTCHitN)auVar126[0x18];
      local_3c0[0x19] = (RTCHitN)auVar126[0x19];
      local_3c0[0x1a] = (RTCHitN)auVar126[0x1a];
      local_3c0[0x1b] = (RTCHitN)auVar126[0x1b];
      local_3c0[0x1c] = (RTCHitN)auVar126[0x1c];
      local_3c0[0x1d] = (RTCHitN)auVar126[0x1d];
      local_3c0[0x1e] = (RTCHitN)auVar126[0x1e];
      local_3c0[0x1f] = (RTCHitN)auVar126[0x1f];
      auVar14 = *(undefined1 (*) [32])(auStack_180 + lVar102) & auVar122;
      bVar59 = (auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar60 = (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar58 = (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = SUB321(auVar14 >> 0x7f,0) == '\0';
      bVar56 = (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar55 = SUB321(auVar14 >> 0xbf,0) == '\0';
      bVar103 = (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar53 = -1 < auVar14[0x1f];
      if (((((((!bVar59 || !bVar60) || !bVar58) || !bVar57) || !bVar56) || !bVar55) || !bVar103) ||
          !bVar53) {
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar186,auVar121,auVar126);
        auVar122 = vshufps_avx(auVar121,auVar121,0xb1);
        auVar122 = vminps_avx(auVar121,auVar122);
        auVar14 = vshufpd_avx(auVar122,auVar122,5);
        auVar14 = vminps_avx(auVar122,auVar14);
        auVar122 = vpermpd_avx2(auVar14,0x4e);
        auVar14 = vminps_avx(auVar14,auVar122);
        auVar121 = vcmpps_avx(auVar121,auVar14,0);
        auVar14 = auVar126 & auVar121;
        if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0x7f,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0xbf,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar14[0x1f] < '\0') {
          auVar126 = vandps_avx(auVar121,auVar126);
        }
        fVar238 = afStack_140[uVar99 * 0x18 + 1];
        uVar101 = (ulong)auStack_138[uVar99 * 0x18];
        uVar97 = vmovmskps_avx(auVar126);
        iVar96 = 0;
        for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
          iVar96 = iVar96 + 1;
        }
        fVar248 = afStack_140[uVar99 * 0x18];
        auVar130._4_4_ = fVar248;
        auVar130._0_4_ = fVar248;
        auVar130._8_4_ = fVar248;
        auVar130._12_4_ = fVar248;
        auVar130._16_4_ = fVar248;
        auVar130._20_4_ = fVar248;
        auVar130._24_4_ = fVar248;
        auVar130._28_4_ = fVar248;
        *(undefined4 *)(local_3c0 + (uint)(iVar96 << 2)) = 0;
        *(RTCHitN (*) [32])(auStack_180 + lVar102) = local_3c0;
        if (((((((((undefined1  [32])local_3c0 >> 0x1f & (undefined1  [32])0x1) !=
                  (undefined1  [32])0x0 ||
                 ((undefined1  [32])local_3c0 >> 0x3f & (undefined1  [32])0x1) !=
                 (undefined1  [32])0x0) ||
                ((undefined1  [32])local_3c0 >> 0x5f & (undefined1  [32])0x1) !=
                (undefined1  [32])0x0) || SUB321((undefined1  [32])local_3c0 >> 0x7f,0) != '\0') ||
              ((undefined1  [32])local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
              ) || SUB321((undefined1  [32])local_3c0 >> 0xbf,0) != '\0') ||
            ((undefined1  [32])local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
            || local_3c0[0x1f] < '\0') {
          uVar99 = uVar98;
        }
        fVar238 = fVar238 - fVar248;
        auVar166._4_4_ = fVar238;
        auVar166._0_4_ = fVar238;
        auVar166._8_4_ = fVar238;
        auVar166._12_4_ = fVar238;
        auVar166._16_4_ = fVar238;
        auVar166._20_4_ = fVar238;
        auVar166._24_4_ = fVar238;
        auVar166._28_4_ = fVar238;
        auVar110 = vfmadd132ps_fma(auVar166,auVar130,_DAT_02020f20);
        local_400 = ZEXT1632(auVar110);
        local_970 = *(undefined8 *)(local_400 + (uint)(iVar96 << 2));
        uStack_968 = 0;
      }
      uVar98 = uVar99;
      auVar207 = ZEXT3264(auVar122);
    } while (((((((bVar59 && bVar60) && bVar58) && bVar57) && bVar56) && bVar55) && bVar103) &&
             bVar53);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }